

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_vertical_8_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  longlong lVar25;
  longlong lVar26;
  longlong lVar27;
  longlong lVar28;
  longlong lVar29;
  longlong lVar30;
  longlong lVar31;
  longlong lVar32;
  longlong lVar33;
  longlong lVar34;
  longlong lVar35;
  longlong lVar36;
  longlong lVar37;
  longlong lVar38;
  longlong lVar39;
  longlong lVar40;
  longlong lVar41;
  longlong lVar42;
  longlong lVar43;
  longlong lVar44;
  longlong lVar45;
  longlong lVar46;
  longlong lVar47;
  longlong lVar48;
  longlong lVar49;
  longlong lVar50;
  longlong lVar51;
  longlong lVar52;
  longlong lVar53;
  longlong lVar54;
  ulong uVar55;
  ulong uVar56;
  longlong lVar57;
  longlong lVar58;
  longlong lVar59;
  longlong lVar60;
  longlong lVar61;
  longlong lVar62;
  longlong lVar63;
  longlong lVar64;
  longlong lVar65;
  longlong lVar66;
  longlong lVar67;
  longlong lVar68;
  longlong lVar69;
  longlong lVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 (*pauVar92) [16];
  undefined4 uVar93;
  ulong *puVar94;
  longlong *plVar95;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  longlong *in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  ushort uVar96;
  ulong uVar97;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar110;
  ushort uVar111;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ulong uVar108;
  ushort uVar112;
  ulong uVar109;
  ulong uVar113;
  ulong uVar114;
  __m128i p1p0;
  __m128i q1q0;
  __m128i q0;
  __m128i p3;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i d7;
  __m128i d6;
  __m128i d5;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i workp_shft1;
  __m128i workp_shft0;
  __m128i workp_c;
  __m128i workp_b;
  __m128i workp_a;
  __m128i one;
  __m128i t80;
  __m128i four;
  __m128i abs_p1p0;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i opq2;
  __m128i work_a;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i q1q0_1;
  __m128i p1p0_1;
  __m128i pq [4];
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i zero;
  __m128i filter1filt;
  __m128i filter2filt;
  __m128i filter2filter1;
  __m128i filt;
  __m128i work;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i t3t4;
  __m128i pmin;
  __m128i pmax;
  __m128i one_1;
  __m128i zero_1;
  __m128i *l;
  __m128i *palVar115;
  __m128i *x0;
  __m128i *d0_00;
  __m128i *d2_00;
  __m128i *d1_00;
  undefined4 in_stack_ffffffffffffec70;
  undefined2 in_stack_ffffffffffffec74;
  undefined2 in_stack_ffffffffffffec76;
  __m128i *in_stack_ffffffffffffec78;
  __m128i *in_stack_ffffffffffffec80;
  __m128i *in_stack_ffffffffffffec88;
  longlong local_1328;
  longlong lStack_1320;
  longlong local_1318;
  longlong lStack_1310;
  longlong local_1308 [3];
  longlong lStack_12f0;
  longlong local_12e8;
  longlong lStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  longlong local_12b8 [2];
  longlong local_12a8 [2];
  longlong local_1298 [2];
  longlong local_1288 [2];
  longlong local_1278;
  longlong lStack_1270;
  longlong local_1268;
  longlong lStack_1260;
  ulong local_1258;
  ulong uStack_1250;
  longlong local_1248;
  longlong lStack_1240;
  uint local_1234;
  uint8_t *local_1230;
  uint8_t *local_1228;
  uint8_t *local_1220;
  int local_1214;
  longlong *local_1210;
  longlong *local_1188;
  undefined8 *local_1180;
  undefined8 *local_1178;
  longlong *local_1170;
  ushort local_1168;
  ushort uStack_1166;
  ushort uStack_1164;
  ushort uStack_1162;
  short sStack_1160;
  short sStack_115e;
  short sStack_115c;
  short sStack_115a;
  ushort local_1158;
  ushort uStack_1156;
  ushort uStack_1154;
  ushort uStack_1152;
  short sStack_1150;
  short sStack_114e;
  short sStack_114c;
  short sStack_114a;
  ushort local_1148;
  ushort uStack_1146;
  ushort uStack_1144;
  ushort uStack_1142;
  short sStack_1140;
  short sStack_113e;
  short sStack_113c;
  short sStack_113a;
  short local_1138;
  short sStack_1136;
  short sStack_1134;
  short sStack_1132;
  short sStack_1130;
  short sStack_112e;
  short sStack_112c;
  short sStack_112a;
  ushort local_1128;
  ushort uStack_1126;
  ushort uStack_1124;
  ushort uStack_1122;
  short sStack_1120;
  short sStack_111e;
  short sStack_111c;
  short sStack_111a;
  undefined8 local_1118;
  undefined8 uStack_1110;
  longlong local_1108;
  longlong lStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  ushort local_10d8;
  ushort uStack_10d6;
  ushort uStack_10d4;
  ushort uStack_10d2;
  ushort uStack_10d0;
  ushort uStack_10ce;
  ushort uStack_10cc;
  ushort uStack_10ca;
  ushort local_10c8;
  ushort uStack_10c6;
  ushort uStack_10c4;
  ushort uStack_10c2;
  ushort uStack_10c0;
  ushort uStack_10be;
  ushort uStack_10bc;
  ushort uStack_10ba;
  ushort local_10b8;
  ushort uStack_10b6;
  ushort uStack_10b4;
  ushort uStack_10b2;
  ushort uStack_10b0;
  ushort uStack_10ae;
  ushort uStack_10ac;
  ushort uStack_10aa;
  ulong local_10a8;
  ulong uStack_10a0;
  ulong local_1098;
  ulong uStack_1090;
  ulong local_1088;
  ulong uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  ulong local_1068;
  ulong uStack_1060;
  longlong local_1058;
  longlong lStack_1050;
  longlong local_1048;
  longlong lStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  longlong local_1028;
  longlong lStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  ulong local_1008;
  ulong uStack_1000;
  ulong local_ff8;
  ulong uStack_ff0;
  longlong local_fe8 [2];
  longlong local_fd8 [2];
  longlong local_fc8 [2];
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  uint local_fa4;
  uint8_t *local_fa0;
  uint8_t *local_f98;
  uint8_t *local_f90;
  undefined1 (*local_f88) [16];
  undefined1 (*local_f80) [16];
  __m128i *local_f78;
  __m128i *local_f70;
  __m128i *local_f68;
  __m128i *local_f60;
  __m128i *local_f58;
  ulong *local_f50;
  __m128i *local_f48;
  longlong *local_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  __m128i *in_stack_fffffffffffff0f0;
  __m128i *in_stack_fffffffffffff0f8;
  __m128i *in_stack_fffffffffffff100;
  __m128i *in_stack_fffffffffffff108;
  undefined8 local_e18;
  undefined1 local_e08 [16];
  undefined1 local_df8 [16];
  undefined1 local_de8 [16];
  undefined1 local_dd8 [16];
  undefined1 local_dc8 [16];
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined1 local_da8 [16];
  undefined1 local_d98 [16];
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  uint local_d64;
  __m128i *local_d60;
  undefined1 (*local_d58) [16];
  undefined1 (*local_d50) [16];
  ulong *local_d48;
  ulong *local_d40;
  ulong *local_d38;
  ulong *local_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  ulong local_d18;
  ulong uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  ulong local_cd8;
  ulong uStack_cd0;
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_ca8;
  ulong uStack_ca0;
  ulong local_c88;
  undefined8 uStack_c80;
  ulong local_c78;
  ulong uStack_c70;
  ulong local_c68;
  ulong uStack_c60;
  ulong local_c58;
  ulong uStack_c50;
  ulong local_c48;
  ulong uStack_c40;
  ulong local_c38;
  ulong uStack_c30;
  ulong local_c28;
  ulong uStack_c20;
  ulong local_c18;
  ulong uStack_c10;
  ulong local_c08;
  undefined8 uStack_c00;
  short local_bf8;
  short sStack_bf6;
  short sStack_bf4;
  short sStack_bf2;
  short sStack_bf0;
  short sStack_bee;
  short sStack_bec;
  ushort uStack_bea;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  ulong uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined2 local_b9e;
  undefined2 local_b9c;
  undefined2 local_b9a;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  short local_b68;
  short sStack_b66;
  short sStack_b64;
  short sStack_b62;
  short sStack_b60;
  short sStack_b5e;
  short sStack_b5c;
  short sStack_b5a;
  undefined8 local_b58;
  undefined8 uStack_b50;
  short local_b48;
  short sStack_b46;
  short sStack_b44;
  short sStack_b42;
  short sStack_b40;
  short sStack_b3e;
  short sStack_b3c;
  short sStack_b3a;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  short local_b08;
  short sStack_b06;
  short sStack_b04;
  short sStack_b02;
  short sStack_b00;
  short sStack_afe;
  short sStack_afc;
  short sStack_afa;
  undefined8 local_af8;
  undefined8 uStack_af0;
  short local_ae8;
  short sStack_ae6;
  short sStack_ae4;
  short sStack_ae2;
  short sStack_ae0;
  short sStack_ade;
  short sStack_adc;
  short sStack_ada;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  short local_aa8;
  short sStack_aa6;
  short sStack_aa4;
  short sStack_aa2;
  short sStack_aa0;
  short sStack_a9e;
  short sStack_a9c;
  short sStack_a9a;
  undefined8 local_a98;
  undefined8 uStack_a90;
  short local_a88;
  short sStack_a86;
  short sStack_a84;
  short sStack_a82;
  short sStack_a80;
  short sStack_a7e;
  short sStack_a7c;
  short sStack_a7a;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  short local_a48;
  short sStack_a46;
  short sStack_a44;
  short sStack_a42;
  short sStack_a40;
  short sStack_a3e;
  short sStack_a3c;
  short sStack_a3a;
  undefined8 local_a38;
  undefined8 uStack_a30;
  short local_a28;
  short sStack_a26;
  short sStack_a24;
  short sStack_a22;
  short sStack_a20;
  short sStack_a1e;
  short sStack_a1c;
  short sStack_a1a;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  short local_9e8;
  short sStack_9e6;
  short sStack_9e4;
  short sStack_9e2;
  short sStack_9e0;
  short sStack_9de;
  short sStack_9dc;
  short sStack_9da;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  short local_988;
  short sStack_986;
  short sStack_984;
  short sStack_982;
  short sStack_980;
  short sStack_97e;
  short sStack_97c;
  short sStack_97a;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  short local_948;
  short sStack_946;
  short sStack_944;
  short sStack_942;
  short sStack_940;
  short sStack_93e;
  short sStack_93c;
  short sStack_93a;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  short local_918;
  short sStack_916;
  short sStack_914;
  short sStack_912;
  short sStack_910;
  short sStack_90e;
  short sStack_90c;
  short sStack_90a;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  longlong local_8d8;
  longlong lStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined4 local_7ac;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined4 local_78c;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined4 local_76c;
  undefined8 local_768;
  undefined8 uStack_760;
  ulong local_758;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 local_748;
  undefined4 uStack_744;
  undefined4 uStack_740;
  undefined4 uStack_73c;
  undefined4 local_738;
  undefined4 uStack_734;
  ulong uStack_730;
  ulong local_718;
  ulong uStack_710;
  ulong local_708;
  ulong uStack_700;
  ulong local_6f8;
  ulong uStack_6f0;
  ulong local_6e8;
  ulong uStack_6e0;
  ulong local_6d8;
  ulong uStack_6d0;
  ulong local_6c8;
  ulong uStack_6c0;
  ulong local_6b8;
  ulong uStack_6b0;
  ulong local_6a8;
  ulong uStack_6a0;
  ulong local_698;
  ulong uStack_690;
  ulong local_688;
  ulong uStack_680;
  ulong local_678;
  ulong uStack_670;
  ulong local_668;
  ulong uStack_660;
  uint local_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  uint local_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  longlong local_618;
  longlong lStack_610;
  longlong local_608;
  longlong lStack_600;
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  longlong local_5d8;
  longlong lStack_5d0;
  ulong local_5c8;
  ulong uStack_5c0;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  ulong local_598;
  ulong uStack_590;
  longlong local_588;
  longlong lStack_580;
  longlong local_578;
  longlong lStack_570;
  ulong local_568;
  ulong uStack_560;
  longlong local_558;
  longlong lStack_550;
  longlong local_548;
  longlong lStack_540;
  longlong local_538;
  longlong lStack_530;
  longlong local_528;
  longlong lStack_520;
  undefined1 local_518 [16];
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  ulong uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  ulong uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  ulong uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  ulong uStack_430;
  ulong local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_388 [16];
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  undefined8 local_358;
  undefined8 uStack_350;
  undefined2 local_348;
  undefined2 local_346;
  undefined2 local_344;
  undefined2 local_342;
  undefined2 local_340;
  undefined2 local_33e;
  undefined2 local_33c;
  undefined2 local_33a;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined2 local_328;
  undefined2 local_326;
  undefined2 local_324;
  undefined2 local_322;
  undefined2 local_320;
  undefined2 local_31e;
  undefined2 local_31c;
  undefined2 local_31a;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined2 local_308;
  undefined2 local_306;
  undefined2 local_304;
  undefined2 local_302;
  undefined2 local_300;
  undefined2 local_2fe;
  undefined2 local_2fc;
  undefined2 local_2fa;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined2 local_2e0;
  undefined2 local_2de;
  undefined2 local_2dc;
  undefined2 local_2da;
  undefined2 local_2d8;
  undefined2 local_2d6;
  undefined2 local_2d4;
  undefined2 local_2d2;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  longlong local_198;
  longlong lStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  ulong uStack_100;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_1170 = in_RDI + -1;
  local_1308[2] = *local_1170;
  lStack_12f0 = *in_RDI;
  local_1178 = (undefined8 *)((long)in_RDI + (long)in_ESI * 2 + -8);
  local_12c8 = *local_1178;
  uStack_12c0 = local_1178[1];
  local_1180 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * 2 + -8);
  local_12d8 = *local_1180;
  uStack_12d0 = local_1180[1];
  local_1188 = (longlong *)((long)in_RDI + (long)(in_ESI * 3) * 2 + -8);
  local_12e8 = *local_1188;
  lStack_12e0 = local_1188[1];
  palVar115 = &local_12a8;
  d0_00 = &local_1298;
  d1_00 = &local_1288;
  d2_00 = (__m128i *)&local_1278;
  x0 = (__m128i *)&local_1268;
  l = &local_12b8;
  local_1234 = in_R9D;
  local_1230 = in_R8;
  local_1228 = in_RCX;
  local_1220 = in_RDX;
  local_1214 = in_ESI;
  local_1210 = in_RDI;
  highbd_transpose4x8_8x4_sse2
            (x0,palVar115,&local_12b8,palVar115,d0_00,d1_00,d2_00,d1_00,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffec76,
                      CONCAT24(in_stack_ffffffffffffec74,in_stack_ffffffffffffec70)),
             in_stack_ffffffffffffec78,in_stack_ffffffffffffec80,in_stack_ffffffffffffec88);
  local_f80 = (undefined1 (*) [16])&local_1318;
  local_f88 = (undefined1 (*) [16])&local_1328;
  local_f90 = local_1220;
  local_f98 = local_1228;
  local_fa0 = local_1230;
  local_fa4 = local_1234;
  local_f38 = 0;
  uStack_f30 = 0;
  local_fb8 = 0;
  uStack_fb0 = 0;
  local_1058 = (*d2_00)[0];
  lStack_1050 = (*d1_00)[0];
  local_1048 = (*x0)[0];
  lStack_1040 = (*d0_00)[0];
  local_1038 = local_1258;
  uStack_1030 = (*palVar115)[0];
  local_1028 = local_1248;
  lStack_1020 = local_12b8[0];
  local_b9a = 4;
  local_33a = 4;
  local_33c = 4;
  local_33e = 4;
  local_340 = 4;
  local_342 = 4;
  local_344 = 4;
  local_346 = 4;
  local_348 = 4;
  local_10f8 = 0x4000400040004;
  uStack_10f0 = 0x4000400040004;
  local_b9c = 1;
  local_31a = 1;
  local_31c = 1;
  local_31e = 1;
  local_320 = 1;
  local_322 = 1;
  local_324 = 1;
  local_326 = 1;
  local_328 = 1;
  local_1118 = 0x1000100010001;
  uStack_1110 = 0x1000100010001;
  local_f78 = d1_00;
  local_f70 = d2_00;
  local_f68 = d0_00;
  local_f60 = x0;
  local_f58 = palVar115;
  local_f50 = &local_1258;
  local_f48 = &local_12b8;
  local_f40 = &local_1248;
  local_358 = local_10f8;
  uStack_350 = uStack_10f0;
  local_338 = local_1118;
  uStack_330 = uStack_1110;
  get_limit(local_1220,local_1228,local_1230,local_1234,&local_fc8,&local_fd8,&local_fe8,
            (__m128i *)&local_1108);
  highbd_hev_filter_mask_x_sse2
            (d1_00,(int)((ulong)d2_00 >> 0x20),d0_00,x0,palVar115,l,in_stack_fffffffffffff0f0,
             in_stack_fffffffffffff0f8,in_stack_fffffffffffff100,in_stack_fffffffffffff108);
  local_d50 = local_f80;
  local_d58 = local_f88;
  local_d64 = local_fa4;
  local_d28 = 0;
  uStack_d20 = 0;
  local_d78 = 0;
  uStack_d70 = 0;
  local_b9e = 1;
  local_2fa = 1;
  local_2fc = 1;
  local_2fe = 1;
  local_300 = 1;
  local_302 = 1;
  local_304 = 1;
  local_306 = 1;
  local_308 = 1;
  local_d88 = 0x1000100010001;
  uStack_d80 = 0x1000100010001;
  local_64c = local_fa4;
  auVar98._8_8_ = 0x1000100010001;
  auVar98._0_8_ = 0x1000100010001;
  local_368 = psllw(auVar98,ZEXT416(local_fa4));
  auVar79._8_8_ = 0x1000100010001;
  auVar79._0_8_ = 0x1000100010001;
  local_388 = psubsw(local_368,auVar79);
  auVar85._8_8_ = lStack_1100;
  auVar85._0_8_ = local_1108;
  local_d98 = psubsw(local_388,auVar85);
  auVar86._8_8_ = lStack_1100;
  auVar86._0_8_ = local_1108;
  local_3a8 = 0;
  uStack_3a0 = 0;
  auVar98 = psubsw(ZEXT816(0),auVar86);
  local_2d2 = 3;
  local_2d4 = 3;
  local_2d6 = 3;
  local_2d8 = 3;
  local_2da = 4;
  local_2dc = 4;
  local_2de = 4;
  local_2e0 = 4;
  local_db8 = 0x4000400040004;
  uStack_db0 = 0x3000300030003;
  auVar90._8_8_ = uStack_1060;
  auVar90._0_8_ = local_1068;
  auVar87._8_8_ = lStack_1100;
  auVar87._0_8_ = local_1108;
  auVar99 = psubsw(auVar90,auVar87);
  auVar89._8_8_ = uStack_1070;
  auVar89._0_8_ = local_1078;
  auVar88._8_8_ = lStack_1100;
  auVar88._0_8_ = local_1108;
  auVar100 = psubsw(auVar89,auVar88);
  local_dc8._0_8_ = auVar99._0_8_;
  local_dc8._8_8_ = auVar99._8_8_;
  local_dd8._0_8_ = auVar100._0_8_;
  local_dd8._8_8_ = auVar100._8_8_;
  local_408 = local_dc8._0_8_;
  uStack_400 = local_dc8._8_8_;
  local_418 = local_dd8._0_8_;
  uStack_410 = local_dd8._8_8_;
  local_de8 = psubsw(auVar99,auVar100);
  local_2c0 = local_da8;
  local_2c8 = local_d98;
  local_1d0 = local_de8;
  uVar1 = local_de8._0_8_;
  uVar2 = local_de8._8_8_;
  local_a8._0_2_ = local_de8._0_2_;
  local_a8._2_2_ = local_de8._2_2_;
  local_a8._4_2_ = local_de8._4_2_;
  local_a8._6_2_ = local_de8._6_2_;
  uStack_a0._0_2_ = local_de8._8_2_;
  uStack_a0._2_2_ = local_de8._10_2_;
  uStack_a0._4_2_ = local_de8._12_2_;
  uStack_a0._6_2_ = local_de8._14_2_;
  local_b8._0_2_ = local_d98._0_2_;
  local_b8._2_2_ = local_d98._2_2_;
  local_b8._4_2_ = local_d98._4_2_;
  local_b8._6_2_ = local_d98._6_2_;
  uStack_b0._0_2_ = local_d98._8_2_;
  uStack_b0._2_2_ = local_d98._10_2_;
  uStack_b0._4_2_ = local_d98._12_2_;
  uStack_b0._6_2_ = local_d98._14_2_;
  local_de8._0_2_ =
       (ushort)((short)local_b8 < (short)local_a8) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_a8) * (short)local_a8;
  local_de8._2_2_ =
       (ushort)(local_b8._2_2_ < local_a8._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_a8._2_2_) * local_a8._2_2_;
  local_de8._4_2_ =
       (ushort)(local_b8._4_2_ < local_a8._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_a8._4_2_) * local_a8._4_2_;
  local_de8._6_2_ =
       (ushort)(local_b8._6_2_ < local_a8._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_a8._6_2_) * local_a8._6_2_;
  local_de8._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_a0) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_a0) * (short)uStack_a0;
  local_de8._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_a0._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_a0._2_2_) * uStack_a0._2_2_;
  local_de8._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_a0._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_a0._4_2_) * uStack_a0._4_2_;
  local_de8._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_a0._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_a0._6_2_) * uStack_a0._6_2_;
  uVar3 = local_de8._0_8_;
  uVar4 = local_de8._8_8_;
  uVar5 = local_da8._0_8_;
  uVar6 = local_da8._8_8_;
  local_1a8._0_2_ = local_de8._0_2_;
  local_1a8._2_2_ = local_de8._2_2_;
  local_1a8._4_2_ = local_de8._4_2_;
  local_1a8._6_2_ = local_de8._6_2_;
  uStack_1a0._0_2_ = local_de8._8_2_;
  uStack_1a0._2_2_ = local_de8._10_2_;
  uStack_1a0._4_2_ = local_de8._12_2_;
  uStack_1a0._6_2_ = local_de8._14_2_;
  local_1b8._0_2_ = local_da8._0_2_;
  local_1b8._2_2_ = local_da8._2_2_;
  local_1b8._4_2_ = local_da8._4_2_;
  local_1b8._6_2_ = local_da8._6_2_;
  uStack_1b0._0_2_ = local_da8._8_2_;
  uStack_1b0._2_2_ = local_da8._10_2_;
  uStack_1b0._4_2_ = local_da8._12_2_;
  uStack_1b0._6_2_ = local_da8._14_2_;
  local_de8._0_2_ =
       (ushort)((short)local_1a8 < (short)local_1b8) * (short)local_1b8 |
       (ushort)((short)local_1a8 >= (short)local_1b8) * (short)local_1a8;
  local_de8._2_2_ =
       (ushort)(local_1a8._2_2_ < local_1b8._2_2_) * local_1b8._2_2_ |
       (ushort)(local_1a8._2_2_ >= local_1b8._2_2_) * local_1a8._2_2_;
  local_de8._4_2_ =
       (ushort)(local_1a8._4_2_ < local_1b8._4_2_) * local_1b8._4_2_ |
       (ushort)(local_1a8._4_2_ >= local_1b8._4_2_) * local_1a8._4_2_;
  local_de8._6_2_ =
       (ushort)(local_1a8._6_2_ < local_1b8._6_2_) * local_1b8._6_2_ |
       (ushort)(local_1a8._6_2_ >= local_1b8._6_2_) * local_1a8._6_2_;
  local_de8._8_2_ =
       (ushort)((short)uStack_1a0 < (short)uStack_1b0) * (short)uStack_1b0 |
       (ushort)((short)uStack_1a0 >= (short)uStack_1b0) * (short)uStack_1a0;
  local_de8._10_2_ =
       (ushort)(uStack_1a0._2_2_ < uStack_1b0._2_2_) * uStack_1b0._2_2_ |
       (ushort)(uStack_1a0._2_2_ >= uStack_1b0._2_2_) * uStack_1a0._2_2_;
  local_de8._12_2_ =
       (ushort)(uStack_1a0._4_2_ < uStack_1b0._4_2_) * uStack_1b0._4_2_ |
       (ushort)(uStack_1a0._4_2_ >= uStack_1b0._4_2_) * uStack_1a0._4_2_;
  local_de8._14_2_ =
       (ushort)(uStack_1a0._6_2_ < uStack_1b0._6_2_) * uStack_1b0._6_2_ |
       (ushort)(uStack_1a0._6_2_ >= uStack_1b0._6_2_) * uStack_1a0._6_2_;
  local_c88 = local_de8._8_8_;
  uStack_c80 = 0;
  local_428 = local_de8._8_8_ & local_1008;
  uStack_420 = 0;
  local_438 = local_de8._0_8_;
  uStack_430 = local_de8._8_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_428;
  auVar101 = psubsw(auVar78,local_de8);
  local_df8._0_8_ = auVar101._0_8_;
  local_df8._8_8_ = auVar101._8_8_;
  local_448 = local_df8._0_8_;
  uStack_440 = local_df8._8_8_;
  local_458 = local_de8._0_8_;
  uStack_450 = local_de8._8_8_;
  auVar101 = psubsw(auVar101,local_de8);
  local_df8._0_8_ = auVar101._0_8_;
  local_df8._8_8_ = auVar101._8_8_;
  local_468 = local_df8._0_8_;
  uStack_460 = local_df8._8_8_;
  local_478 = local_de8._0_8_;
  uStack_470 = local_de8._8_8_;
  local_df8 = psubsw(auVar101,local_de8);
  local_210 = local_df8;
  uVar7 = local_df8._0_8_;
  uVar8 = local_df8._8_8_;
  local_98 = local_d98._0_8_;
  uStack_90 = local_d98._8_8_;
  local_88._0_2_ = local_df8._0_2_;
  local_88._2_2_ = local_df8._2_2_;
  local_88._4_2_ = local_df8._4_2_;
  local_88._6_2_ = local_df8._6_2_;
  uStack_80._0_2_ = local_df8._8_2_;
  uStack_80._2_2_ = local_df8._10_2_;
  uStack_80._4_2_ = local_df8._12_2_;
  uStack_80._6_2_ = local_df8._14_2_;
  local_df8._0_2_ =
       (ushort)((short)local_b8 < (short)local_88) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_88) * (short)local_88;
  local_df8._2_2_ =
       (ushort)(local_b8._2_2_ < local_88._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_88._2_2_) * local_88._2_2_;
  local_df8._4_2_ =
       (ushort)(local_b8._4_2_ < local_88._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_88._4_2_) * local_88._4_2_;
  local_df8._6_2_ =
       (ushort)(local_b8._6_2_ < local_88._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_88._6_2_) * local_88._6_2_;
  local_df8._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_80) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_80) * (short)uStack_80;
  local_df8._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_80._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_80._2_2_) * uStack_80._2_2_;
  local_df8._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_80._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_80._4_2_) * uStack_80._4_2_;
  local_df8._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_80._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_80._6_2_) * uStack_80._6_2_;
  uVar9 = local_df8._0_8_;
  uVar10 = local_df8._8_8_;
  local_da8._0_8_ = auVar98._0_8_;
  uVar11 = local_da8._0_8_;
  local_da8._8_8_ = auVar98._8_8_;
  uVar12 = local_da8._8_8_;
  local_1e8._0_2_ = local_df8._0_2_;
  local_1e8._2_2_ = local_df8._2_2_;
  local_1e8._4_2_ = local_df8._4_2_;
  local_1e8._6_2_ = local_df8._6_2_;
  uStack_1e0._0_2_ = local_df8._8_2_;
  uStack_1e0._2_2_ = local_df8._10_2_;
  uStack_1e0._4_2_ = local_df8._12_2_;
  uStack_1e0._6_2_ = local_df8._14_2_;
  local_1f8._0_2_ = auVar98._0_2_;
  local_1f8._2_2_ = auVar98._2_2_;
  local_1f8._4_2_ = auVar98._4_2_;
  local_1f8._6_2_ = auVar98._6_2_;
  uStack_1f0._0_2_ = auVar98._8_2_;
  uStack_1f0._2_2_ = auVar98._10_2_;
  uStack_1f0._4_2_ = auVar98._12_2_;
  uStack_1f0._6_2_ = auVar98._14_2_;
  local_df8._0_2_ =
       (ushort)((short)local_1e8 < (short)local_1f8) * (short)local_1f8 |
       (ushort)((short)local_1e8 >= (short)local_1f8) * (short)local_1e8;
  local_df8._2_2_ =
       (ushort)(local_1e8._2_2_ < local_1f8._2_2_) * local_1f8._2_2_ |
       (ushort)(local_1e8._2_2_ >= local_1f8._2_2_) * local_1e8._2_2_;
  local_df8._4_2_ =
       (ushort)(local_1e8._4_2_ < local_1f8._4_2_) * local_1f8._4_2_ |
       (ushort)(local_1e8._4_2_ >= local_1f8._4_2_) * local_1e8._4_2_;
  local_df8._6_2_ =
       (ushort)(local_1e8._6_2_ < local_1f8._6_2_) * local_1f8._6_2_ |
       (ushort)(local_1e8._6_2_ >= local_1f8._6_2_) * local_1e8._6_2_;
  local_df8._8_2_ =
       (ushort)((short)uStack_1e0 < (short)uStack_1f0) * (short)uStack_1f0 |
       (ushort)((short)uStack_1e0 >= (short)uStack_1f0) * (short)uStack_1e0;
  local_df8._10_2_ =
       (ushort)(uStack_1e0._2_2_ < uStack_1f0._2_2_) * uStack_1f0._2_2_ |
       (ushort)(uStack_1e0._2_2_ >= uStack_1f0._2_2_) * uStack_1e0._2_2_;
  local_df8._12_2_ =
       (ushort)(uStack_1e0._4_2_ < uStack_1f0._4_2_) * uStack_1f0._4_2_ |
       (ushort)(uStack_1e0._4_2_ >= uStack_1f0._4_2_) * uStack_1e0._4_2_;
  local_df8._14_2_ =
       (ushort)(uStack_1e0._6_2_ < uStack_1f0._6_2_) * uStack_1f0._6_2_ |
       (ushort)(uStack_1e0._6_2_ >= uStack_1f0._6_2_) * uStack_1e0._6_2_;
  local_df8._0_8_ = SUB168(local_df8,0);
  local_df8._8_8_ = SUB168(local_df8,8);
  local_ca8 = local_df8._0_8_;
  uStack_ca0 = local_df8._8_8_;
  local_cd8 = local_df8._0_8_ & local_ff8;
  uStack_cd0 = local_df8._8_8_ & uStack_ff0;
  local_118 = 0x4000400040004;
  uStack_110 = 0x3000300030003;
  auVar84._8_8_ = local_cd8;
  auVar84._0_8_ = local_cd8;
  auVar83._8_8_ = 0x3000300030003;
  auVar83._0_8_ = 0x4000400040004;
  local_e08 = paddsw(auVar84,auVar83);
  local_250 = local_e08;
  uVar13 = local_e08._0_8_;
  uVar14 = local_e08._8_8_;
  local_78 = local_d98._0_8_;
  uStack_70 = local_d98._8_8_;
  local_68._0_2_ = local_e08._0_2_;
  local_68._2_2_ = local_e08._2_2_;
  local_68._4_2_ = local_e08._4_2_;
  local_68._6_2_ = local_e08._6_2_;
  uStack_60._0_2_ = local_e08._8_2_;
  uStack_60._2_2_ = local_e08._10_2_;
  uStack_60._4_2_ = local_e08._12_2_;
  uStack_60._6_2_ = local_e08._14_2_;
  local_e08._0_2_ =
       (ushort)((short)local_b8 < (short)local_68) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_68) * (short)local_68;
  local_e08._2_2_ =
       (ushort)(local_b8._2_2_ < local_68._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_68._2_2_) * local_68._2_2_;
  local_e08._4_2_ =
       (ushort)(local_b8._4_2_ < local_68._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_68._4_2_) * local_68._4_2_;
  local_e08._6_2_ =
       (ushort)(local_b8._6_2_ < local_68._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_68._6_2_) * local_68._6_2_;
  local_e08._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_60) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_60) * (short)uStack_60;
  local_e08._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_60._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_60._2_2_) * uStack_60._2_2_;
  local_e08._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_60._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_60._4_2_) * uStack_60._4_2_;
  local_e08._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_60._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_60._6_2_) * uStack_60._6_2_;
  uVar15 = local_e08._0_8_;
  uVar16 = local_e08._8_8_;
  local_238 = local_da8._0_8_;
  uStack_230 = local_da8._8_8_;
  local_228._0_2_ = local_e08._0_2_;
  local_228._2_2_ = local_e08._2_2_;
  local_228._4_2_ = local_e08._4_2_;
  local_228._6_2_ = local_e08._6_2_;
  uStack_220._0_2_ = local_e08._8_2_;
  uStack_220._2_2_ = local_e08._10_2_;
  uStack_220._4_2_ = local_e08._12_2_;
  uStack_220._6_2_ = local_e08._14_2_;
  local_e08._0_2_ =
       (ushort)((short)local_228 < (short)local_1f8) * (short)local_1f8 |
       (ushort)((short)local_228 >= (short)local_1f8) * (short)local_228;
  local_e08._2_2_ =
       (ushort)(local_228._2_2_ < local_1f8._2_2_) * local_1f8._2_2_ |
       (ushort)(local_228._2_2_ >= local_1f8._2_2_) * local_228._2_2_;
  local_e08._4_2_ =
       (ushort)(local_228._4_2_ < local_1f8._4_2_) * local_1f8._4_2_ |
       (ushort)(local_228._4_2_ >= local_1f8._4_2_) * local_228._4_2_;
  local_e08._6_2_ =
       (ushort)(local_228._6_2_ < local_1f8._6_2_) * local_1f8._6_2_ |
       (ushort)(local_228._6_2_ >= local_1f8._6_2_) * local_228._6_2_;
  local_e08._8_2_ =
       (ushort)((short)uStack_220 < (short)uStack_1f0) * (short)uStack_1f0 |
       (ushort)((short)uStack_220 >= (short)uStack_1f0) * (short)uStack_220;
  local_e08._10_2_ =
       (ushort)(uStack_220._2_2_ < uStack_1f0._2_2_) * uStack_1f0._2_2_ |
       (ushort)(uStack_220._2_2_ >= uStack_1f0._2_2_) * uStack_220._2_2_;
  local_e08._12_2_ =
       (ushort)(uStack_220._4_2_ < uStack_1f0._4_2_) * uStack_1f0._4_2_ |
       (ushort)(uStack_220._4_2_ >= uStack_1f0._4_2_) * uStack_220._4_2_;
  local_e08._14_2_ =
       (ushort)(uStack_220._6_2_ < uStack_1f0._6_2_) * uStack_1f0._6_2_ |
       (ushort)(uStack_220._6_2_ >= uStack_1f0._6_2_) * uStack_220._6_2_;
  local_c8 = local_e08._0_8_;
  uStack_c0 = local_e08._8_8_;
  local_cc = 3;
  auVar102 = psraw(local_e08,ZEXT416(3));
  local_e08._0_8_ = auVar102._0_8_;
  local_e08._8_8_ = auVar102._8_8_;
  uStack_d00 = local_e08._8_8_;
  local_ce8 = local_e08._0_8_;
  uStack_ce0 = local_e08._8_8_;
  local_cf8 = local_e08._0_8_;
  uStack_cf0 = local_e08._8_8_;
  local_128 = local_e08._0_8_;
  uStack_120 = local_e08._0_8_;
  local_138 = 0x1000100010001;
  uStack_130 = 0x1000100010001;
  auVar82._8_8_ = local_e08._0_8_;
  auVar82._0_8_ = local_e08._0_8_;
  auVar81._8_8_ = 0x1000100010001;
  auVar81._0_8_ = 0x1000100010001;
  auVar101 = paddsw(auVar82,auVar81);
  local_df8._0_8_ = auVar101._0_8_;
  local_df8._8_8_ = auVar101._8_8_;
  local_e8 = local_df8._0_8_;
  uStack_e0 = local_df8._8_8_;
  local_ec = 1;
  auVar103 = psraw(auVar101,ZEXT416(1));
  local_df8._0_8_ = auVar103._0_8_;
  local_df8._8_8_ = auVar103._8_8_;
  uStack_730 = local_df8._8_8_;
  local_d18 = ~local_1008 & local_df8._0_8_;
  uStack_d10 = ~uStack_1000 & local_df8._8_8_;
  local_df8._8_8_ = uStack_d10;
  local_df8._0_8_ = local_d18;
  auVar101 = local_df8;
  local_e08._12_4_ = auVar102._12_4_;
  uVar93 = local_e08._12_4_;
  local_df8._0_4_ = (undefined4)local_d18;
  local_df8._12_4_ = (undefined4)(uStack_d10 >> 0x20);
  uStack_73c = local_e08._12_4_;
  _local_738 = CONCAT44(auVar103._4_4_,local_df8._0_4_);
  uStack_74c = local_df8._12_4_;
  _local_748 = CONCAT44(auVar102._4_4_,local_de8._0_4_);
  local_e08._4_4_ = local_df8._12_4_;
  local_e08._0_4_ = uStack_750;
  local_e08 = CONCAT88(uStack_d00,local_e08._0_8_);
  local_d08 = local_e08._0_8_;
  local_488 = local_dd8._0_8_;
  uStack_480 = local_dd8._8_8_;
  local_498 = local_e08._0_8_;
  auVar77._8_8_ = local_d18;
  auVar77._0_8_ = local_e08._0_8_;
  local_dd8 = psubsw(auVar100,auVar77);
  uStack_150 = CONCAT44(uVar93,uStack_740);
  local_148 = local_dc8._0_8_;
  uStack_140 = local_dc8._8_8_;
  auVar80._8_8_ = uStack_150;
  auVar80._0_8_ = local_e18;
  local_dc8 = paddsw(auVar99,auVar80);
  local_290 = local_dd8;
  uVar17 = local_dd8._0_8_;
  uVar18 = local_dd8._8_8_;
  local_58 = local_d98._0_8_;
  uStack_50 = local_d98._8_8_;
  local_48._0_2_ = local_dd8._0_2_;
  local_48._2_2_ = local_dd8._2_2_;
  local_48._4_2_ = local_dd8._4_2_;
  local_48._6_2_ = local_dd8._6_2_;
  uStack_40._0_2_ = local_dd8._8_2_;
  uStack_40._2_2_ = local_dd8._10_2_;
  uStack_40._4_2_ = local_dd8._12_2_;
  uStack_40._6_2_ = local_dd8._14_2_;
  local_dd8._0_2_ =
       (ushort)((short)local_b8 < (short)local_48) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_48) * (short)local_48;
  local_dd8._2_2_ =
       (ushort)(local_b8._2_2_ < local_48._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_48._2_2_) * local_48._2_2_;
  local_dd8._4_2_ =
       (ushort)(local_b8._4_2_ < local_48._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_48._4_2_) * local_48._4_2_;
  local_dd8._6_2_ =
       (ushort)(local_b8._6_2_ < local_48._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_48._6_2_) * local_48._6_2_;
  local_dd8._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_40) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_40) * (short)uStack_40;
  local_dd8._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_40._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_40._2_2_) * uStack_40._2_2_;
  local_dd8._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_40._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_40._4_2_) * uStack_40._4_2_;
  local_dd8._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_40._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_40._6_2_) * uStack_40._6_2_;
  uVar19 = local_dd8._0_8_;
  uVar20 = local_dd8._8_8_;
  local_278 = local_da8._0_8_;
  uStack_270 = local_da8._8_8_;
  local_268._0_2_ = local_dd8._0_2_;
  local_268._2_2_ = local_dd8._2_2_;
  local_268._4_2_ = local_dd8._4_2_;
  local_268._6_2_ = local_dd8._6_2_;
  uStack_260._0_2_ = local_dd8._8_2_;
  uStack_260._2_2_ = local_dd8._10_2_;
  uStack_260._4_2_ = local_dd8._12_2_;
  uStack_260._6_2_ = local_dd8._14_2_;
  local_dd8._0_2_ =
       (ushort)((short)local_268 < (short)local_1f8) * (short)local_1f8 |
       (ushort)((short)local_268 >= (short)local_1f8) * (short)local_268;
  local_dd8._2_2_ =
       (ushort)(local_268._2_2_ < local_1f8._2_2_) * local_1f8._2_2_ |
       (ushort)(local_268._2_2_ >= local_1f8._2_2_) * local_268._2_2_;
  local_dd8._4_2_ =
       (ushort)(local_268._4_2_ < local_1f8._4_2_) * local_1f8._4_2_ |
       (ushort)(local_268._4_2_ >= local_1f8._4_2_) * local_268._4_2_;
  local_dd8._6_2_ =
       (ushort)(local_268._6_2_ < local_1f8._6_2_) * local_1f8._6_2_ |
       (ushort)(local_268._6_2_ >= local_1f8._6_2_) * local_268._6_2_;
  local_dd8._8_2_ =
       (ushort)((short)uStack_260 < (short)uStack_1f0) * (short)uStack_1f0 |
       (ushort)((short)uStack_260 >= (short)uStack_1f0) * (short)uStack_260;
  local_dd8._10_2_ =
       (ushort)(uStack_260._2_2_ < uStack_1f0._2_2_) * uStack_1f0._2_2_ |
       (ushort)(uStack_260._2_2_ >= uStack_1f0._2_2_) * uStack_260._2_2_;
  local_dd8._12_2_ =
       (ushort)(uStack_260._4_2_ < uStack_1f0._4_2_) * uStack_1f0._4_2_ |
       (ushort)(uStack_260._4_2_ >= uStack_1f0._4_2_) * uStack_260._4_2_;
  local_dd8._14_2_ =
       (ushort)(uStack_260._6_2_ < uStack_1f0._6_2_) * uStack_1f0._6_2_ |
       (ushort)(uStack_260._6_2_ >= uStack_1f0._6_2_) * uStack_260._6_2_;
  local_2d0 = local_dc8;
  uVar21 = local_dc8._0_8_;
  uVar22 = local_dc8._8_8_;
  local_38 = local_d98._0_8_;
  uStack_30 = local_d98._8_8_;
  local_28._0_2_ = local_dc8._0_2_;
  local_28._2_2_ = local_dc8._2_2_;
  local_28._4_2_ = local_dc8._4_2_;
  local_28._6_2_ = local_dc8._6_2_;
  uStack_20._0_2_ = local_dc8._8_2_;
  uStack_20._2_2_ = local_dc8._10_2_;
  uStack_20._4_2_ = local_dc8._12_2_;
  uStack_20._6_2_ = local_dc8._14_2_;
  local_dc8._0_2_ =
       (ushort)((short)local_b8 < (short)local_28) * (short)local_b8 |
       (ushort)((short)local_b8 >= (short)local_28) * (short)local_28;
  local_dc8._2_2_ =
       (ushort)(local_b8._2_2_ < local_28._2_2_) * local_b8._2_2_ |
       (ushort)(local_b8._2_2_ >= local_28._2_2_) * local_28._2_2_;
  local_dc8._4_2_ =
       (ushort)(local_b8._4_2_ < local_28._4_2_) * local_b8._4_2_ |
       (ushort)(local_b8._4_2_ >= local_28._4_2_) * local_28._4_2_;
  local_dc8._6_2_ =
       (ushort)(local_b8._6_2_ < local_28._6_2_) * local_b8._6_2_ |
       (ushort)(local_b8._6_2_ >= local_28._6_2_) * local_28._6_2_;
  local_dc8._8_2_ =
       (ushort)((short)uStack_b0 < (short)uStack_20) * (short)uStack_b0 |
       (ushort)((short)uStack_b0 >= (short)uStack_20) * (short)uStack_20;
  local_dc8._10_2_ =
       (ushort)(uStack_b0._2_2_ < uStack_20._2_2_) * uStack_b0._2_2_ |
       (ushort)(uStack_b0._2_2_ >= uStack_20._2_2_) * uStack_20._2_2_;
  local_dc8._12_2_ =
       (ushort)(uStack_b0._4_2_ < uStack_20._4_2_) * uStack_b0._4_2_ |
       (ushort)(uStack_b0._4_2_ >= uStack_20._4_2_) * uStack_20._4_2_;
  local_dc8._14_2_ =
       (ushort)(uStack_b0._6_2_ < uStack_20._6_2_) * uStack_b0._6_2_ |
       (ushort)(uStack_b0._6_2_ >= uStack_20._6_2_) * uStack_20._6_2_;
  uVar23 = local_dc8._0_8_;
  uVar24 = local_dc8._8_8_;
  local_2b8 = local_da8._0_8_;
  uStack_2b0 = local_da8._8_8_;
  local_2a8._0_2_ = local_dc8._0_2_;
  local_2a8._2_2_ = local_dc8._2_2_;
  local_2a8._4_2_ = local_dc8._4_2_;
  local_2a8._6_2_ = local_dc8._6_2_;
  uStack_2a0._0_2_ = local_dc8._8_2_;
  uStack_2a0._2_2_ = local_dc8._10_2_;
  uStack_2a0._4_2_ = local_dc8._12_2_;
  uStack_2a0._6_2_ = local_dc8._14_2_;
  local_dc8._0_2_ =
       (ushort)((short)local_2a8 < (short)local_1f8) * (short)local_1f8 |
       (ushort)((short)local_2a8 >= (short)local_1f8) * (short)local_2a8;
  local_dc8._2_2_ =
       (ushort)(local_2a8._2_2_ < local_1f8._2_2_) * local_1f8._2_2_ |
       (ushort)(local_2a8._2_2_ >= local_1f8._2_2_) * local_2a8._2_2_;
  local_dc8._4_2_ =
       (ushort)(local_2a8._4_2_ < local_1f8._4_2_) * local_1f8._4_2_ |
       (ushort)(local_2a8._4_2_ >= local_1f8._4_2_) * local_2a8._4_2_;
  local_dc8._6_2_ =
       (ushort)(local_2a8._6_2_ < local_1f8._6_2_) * local_1f8._6_2_ |
       (ushort)(local_2a8._6_2_ >= local_1f8._6_2_) * local_2a8._6_2_;
  local_dc8._8_2_ =
       (ushort)((short)uStack_2a0 < (short)uStack_1f0) * (short)uStack_1f0 |
       (ushort)((short)uStack_2a0 >= (short)uStack_1f0) * (short)uStack_2a0;
  local_dc8._10_2_ =
       (ushort)(uStack_2a0._2_2_ < uStack_1f0._2_2_) * uStack_1f0._2_2_ |
       (ushort)(uStack_2a0._2_2_ >= uStack_1f0._2_2_) * uStack_2a0._2_2_;
  local_dc8._12_2_ =
       (ushort)(uStack_2a0._4_2_ < uStack_1f0._4_2_) * uStack_1f0._4_2_ |
       (ushort)(uStack_2a0._4_2_ >= uStack_1f0._4_2_) * uStack_2a0._4_2_;
  local_dc8._14_2_ =
       (ushort)(uStack_2a0._6_2_ < uStack_1f0._6_2_) * uStack_1f0._6_2_ |
       (ushort)(uStack_2a0._6_2_ >= uStack_1f0._6_2_) * uStack_2a0._6_2_;
  auVar91._8_8_ = lStack_1100;
  auVar91._0_8_ = local_1108;
  local_168 = local_dd8._0_8_;
  uStack_160 = local_dd8._8_8_;
  auVar99 = paddsw(local_dd8,auVar91);
  local_df8 = auVar101;
  local_da8 = auVar98;
  local_d60 = (__m128i *)&local_1108;
  local_d48 = &local_ff8;
  local_d40 = &local_1008;
  local_d38 = &local_1078;
  local_d30 = &local_1068;
  local_cc8 = local_cd8;
  uStack_cc0 = uStack_cd0;
  local_758 = local_d18;
  local_648 = local_d88;
  uStack_640 = uStack_d80;
  uStack_490 = local_d18;
  local_378 = local_d88;
  uStack_370 = uStack_d80;
  local_318 = local_d88;
  uStack_310 = uStack_d80;
  local_2f8 = local_db8;
  uStack_2f0 = uStack_db0;
  local_2a8 = uVar23;
  uStack_2a0 = uVar24;
  local_288 = local_2c8;
  local_280 = local_2c0;
  local_268 = uVar19;
  uStack_260 = uVar20;
  local_248 = local_2c8;
  local_240 = local_2c0;
  local_228 = uVar15;
  uStack_220 = uVar16;
  local_208 = local_2c8;
  local_200 = local_2c0;
  local_1f8 = uVar11;
  uStack_1f0 = uVar12;
  local_1e8 = uVar9;
  uStack_1e0 = uVar10;
  local_1c8 = local_2c8;
  local_1c0 = local_2c0;
  local_1b8 = uVar5;
  uStack_1b0 = uVar6;
  local_1a8 = uVar3;
  uStack_1a0 = uVar4;
  local_108 = local_cd8;
  uStack_100 = local_cd8;
  local_b8 = local_d98._0_8_;
  uStack_b0 = local_d98._8_8_;
  local_a8 = uVar1;
  uStack_a0 = uVar2;
  local_88 = uVar7;
  uStack_80 = uVar8;
  local_68 = uVar13;
  uStack_60 = uVar14;
  local_48 = uVar17;
  uStack_40 = uVar18;
  local_28 = uVar21;
  uStack_20 = uVar22;
  *local_f80 = auVar99;
  local_198 = (*local_d60)[0];
  lStack_190 = (*local_d60)[1];
  local_188 = local_dc8._0_8_;
  uStack_180 = local_dc8._8_8_;
  auVar101 = paddsw(local_dc8,(undefined1  [16])*local_d60);
  *local_d58 = auVar101;
  pauVar92 = local_f80;
  local_5c8 = local_1038;
  uStack_5c0 = uStack_1030;
  local_5d8 = local_1058;
  lStack_5d0 = lStack_1050;
  local_568 = local_1038;
  uStack_560 = uStack_1030;
  local_578 = local_1058;
  lStack_570 = lStack_1050;
  auVar71._8_8_ = uStack_1030;
  auVar71._0_8_ = local_1038;
  auVar103._8_8_ = lStack_1050;
  auVar103._0_8_ = local_1058;
  local_5a8 = psubusw(auVar71,auVar103);
  local_588 = local_1058;
  lStack_580 = lStack_1050;
  local_598 = local_1038;
  uStack_590 = uStack_1030;
  auVar102._8_8_ = lStack_1050;
  auVar102._0_8_ = local_1058;
  auVar100._8_8_ = uStack_1030;
  auVar100._0_8_ = local_1038;
  local_5b8 = psubusw(auVar102,auVar100);
  uVar113 = local_5a8._0_8_ | local_5b8._0_8_;
  uVar114 = local_5a8._8_8_ | local_5b8._8_8_;
  local_608 = local_1028;
  lStack_600 = lStack_1020;
  local_618 = local_1058;
  lStack_610 = lStack_1050;
  local_528 = local_1028;
  lStack_520 = lStack_1020;
  local_538 = local_1058;
  lStack_530 = lStack_1050;
  auVar75._8_8_ = lStack_1020;
  auVar75._0_8_ = local_1028;
  auVar74._8_8_ = lStack_1050;
  auVar74._0_8_ = local_1058;
  local_5e8 = psubusw(auVar75,auVar74);
  local_548 = local_1058;
  lStack_540 = lStack_1050;
  local_558 = local_1028;
  lStack_550 = lStack_1020;
  auVar73._8_8_ = lStack_1050;
  auVar73._0_8_ = local_1058;
  auVar72._8_8_ = lStack_1020;
  auVar72._0_8_ = local_1028;
  local_5f8 = psubusw(auVar73,auVar72);
  uVar97 = local_5e8._0_8_ | local_5f8._0_8_;
  uVar108 = local_5e8._8_8_ | local_5f8._8_8_;
  local_4a8._0_2_ = (short)uVar113;
  local_4a8._2_2_ = (short)(uVar113 >> 0x10);
  local_4a8._4_2_ = (short)(uVar113 >> 0x20);
  local_4a8._6_2_ = (short)(uVar113 >> 0x30);
  uStack_4a0._0_2_ = (short)uVar114;
  uStack_4a0._2_2_ = (short)(uVar114 >> 0x10);
  uStack_4a0._4_2_ = (short)(uVar114 >> 0x20);
  uStack_4a0._6_2_ = (short)(uVar114 >> 0x30);
  local_4b8._0_2_ = (short)uVar97;
  local_4b8._2_2_ = (short)(uVar97 >> 0x10);
  local_4b8._4_2_ = (short)(uVar97 >> 0x20);
  local_4b8._6_2_ = (short)(uVar97 >> 0x30);
  uStack_4b0._0_2_ = (short)uVar108;
  uStack_4b0._2_2_ = (short)(uVar108 >> 0x10);
  uStack_4b0._4_2_ = (short)(uVar108 >> 0x20);
  uStack_4b0._6_2_ = (short)(uVar108 >> 0x30);
  uVar96 = (ushort)((short)local_4a8 < (short)local_4b8) * (short)local_4b8 |
           (ushort)((short)local_4a8 >= (short)local_4b8) * (short)local_4a8;
  uVar104 = (ushort)(local_4a8._2_2_ < local_4b8._2_2_) * local_4b8._2_2_ |
            (ushort)(local_4a8._2_2_ >= local_4b8._2_2_) * local_4a8._2_2_;
  uVar105 = (ushort)(local_4a8._4_2_ < local_4b8._4_2_) * local_4b8._4_2_ |
            (ushort)(local_4a8._4_2_ >= local_4b8._4_2_) * local_4a8._4_2_;
  uVar106 = (ushort)(local_4a8._6_2_ < local_4b8._6_2_) * local_4b8._6_2_ |
            (ushort)(local_4a8._6_2_ >= local_4b8._6_2_) * local_4a8._6_2_;
  uVar107 = (ushort)((short)uStack_4a0 < (short)uStack_4b0) * (short)uStack_4b0 |
            (ushort)((short)uStack_4a0 >= (short)uStack_4b0) * (short)uStack_4a0;
  uVar110 = (ushort)(uStack_4a0._2_2_ < uStack_4b0._2_2_) * uStack_4b0._2_2_ |
            (ushort)(uStack_4a0._2_2_ >= uStack_4b0._2_2_) * uStack_4a0._2_2_;
  uVar111 = (ushort)(uStack_4a0._4_2_ < uStack_4b0._4_2_) * uStack_4b0._4_2_ |
            (ushort)(uStack_4a0._4_2_ >= uStack_4b0._4_2_) * uStack_4a0._4_2_;
  uVar112 = (ushort)(uStack_4a0._6_2_ < uStack_4b0._6_2_) * uStack_4b0._6_2_ |
            (ushort)(uStack_4a0._6_2_ >= uStack_4b0._6_2_) * uStack_4a0._6_2_;
  local_1018._0_4_ = CONCAT22(uVar104,uVar96);
  local_1018._0_6_ = CONCAT24(uVar105,(undefined4)local_1018);
  local_1018 = CONCAT26(uVar106,(undefined6)local_1018);
  uStack_1010._0_2_ = uVar107;
  uStack_1010._2_2_ = uVar110;
  uStack_1010._4_2_ = uVar111;
  uStack_1010._6_2_ = uVar112;
  local_4c8 = local_10e8;
  uVar5 = local_4c8;
  uStack_4c0 = uStack_10e0;
  uVar6 = uStack_4c0;
  local_4d8 = local_1018;
  uStack_4d0 = uStack_1010;
  local_4c8._0_2_ = (short)local_10e8;
  local_4c8._2_2_ = (short)((ulong)local_10e8 >> 0x10);
  local_4c8._4_2_ = (short)((ulong)local_10e8 >> 0x20);
  local_4c8._6_2_ = (short)((ulong)local_10e8 >> 0x30);
  uStack_4c0._0_2_ = (short)uStack_10e0;
  uStack_4c0._2_2_ = (short)((ulong)uStack_10e0 >> 0x10);
  uStack_4c0._4_2_ = (short)((ulong)uStack_10e0 >> 0x20);
  uStack_4c0._6_2_ = (short)((ulong)uStack_10e0 >> 0x30);
  uVar96 = ((short)local_4c8 < (short)uVar96) * uVar96 |
           (ushort)((short)local_4c8 >= (short)uVar96) * (short)local_4c8;
  uVar104 = (local_4c8._2_2_ < (short)uVar104) * uVar104 |
            (ushort)(local_4c8._2_2_ >= (short)uVar104) * local_4c8._2_2_;
  uVar105 = (local_4c8._4_2_ < (short)uVar105) * uVar105 |
            (ushort)(local_4c8._4_2_ >= (short)uVar105) * local_4c8._4_2_;
  uVar106 = (local_4c8._6_2_ < (short)uVar106) * uVar106 |
            (ushort)(local_4c8._6_2_ >= (short)uVar106) * local_4c8._6_2_;
  uVar107 = ((short)uStack_4c0 < (short)uVar107) * uVar107 |
            (ushort)((short)uStack_4c0 >= (short)uVar107) * (short)uStack_4c0;
  uVar110 = (uStack_4c0._2_2_ < (short)uVar110) * uVar110 |
            (ushort)(uStack_4c0._2_2_ >= (short)uVar110) * uStack_4c0._2_2_;
  uVar111 = (uStack_4c0._4_2_ < (short)uVar111) * uVar111 |
            (ushort)(uStack_4c0._4_2_ >= (short)uVar111) * uStack_4c0._4_2_;
  uVar112 = (uStack_4c0._6_2_ < (short)uVar112) * uVar112 |
            (ushort)(uStack_4c0._6_2_ >= (short)uVar112) * uStack_4c0._6_2_;
  local_1018._0_4_ = CONCAT22(uVar104,uVar96);
  local_1018._0_6_ = CONCAT24(uVar105,(undefined4)local_1018);
  local_1018 = CONCAT26(uVar106,(undefined6)local_1018);
  uStack_1010._0_2_ = uVar107;
  uStack_1010._2_2_ = uVar110;
  uStack_1010._4_2_ = uVar111;
  uStack_1010._6_2_ = uVar112;
  local_4e8 = local_1018;
  uStack_4e0 = uStack_1010;
  local_4f8 = uStack_1010;
  uStack_4f0 = 0;
  local_1018._0_4_ =
       CONCAT22(((short)uVar104 < (short)uVar110) * uVar110 |
                ((short)uVar104 >= (short)uVar110) * uVar104,
                ((short)uVar96 < (short)uVar107) * uVar107 |
                ((short)uVar96 >= (short)uVar107) * uVar96);
  local_1018._0_6_ =
       CONCAT24(((short)uVar105 < (short)uVar111) * uVar111 |
                ((short)uVar105 >= (short)uVar111) * uVar105,(undefined4)local_1018);
  local_1018 = CONCAT26(((short)uVar106 < (short)uVar112) * uVar112 |
                        ((short)uVar106 >= (short)uVar112) * uVar106,(undefined6)local_1018);
  uStack_1010._0_2_ = (-1 < (short)uVar107) * uVar107;
  uStack_1010._2_2_ = (-1 < (short)uVar110) * uVar110;
  uStack_1010._4_2_ = (-1 < (short)uVar111) * uVar111;
  uStack_1010._6_2_ = (-1 < (short)uVar112) * uVar112;
  local_62c = local_fa4 - 8;
  local_628 = local_1118;
  uStack_620 = uStack_1110;
  auVar99._8_8_ = uStack_1110;
  auVar99._0_8_ = local_1118;
  local_518 = psllw(auVar99,ZEXT416(local_62c));
  local_508 = local_1018;
  uStack_500 = uStack_1010;
  auVar76._8_8_ = uStack_1010;
  auVar76._0_8_ = local_1018;
  auVar101 = psubusw(auVar76,local_518);
  local_1018 = auVar101._0_8_;
  uStack_1010 = auVar101._8_8_;
  local_bb8 = local_1018;
  uVar3 = local_bb8;
  uStack_bb0 = uStack_1010;
  uVar4 = uStack_bb0;
  local_bc8 = local_fb8;
  uVar1 = local_bc8;
  uStack_bc0 = uStack_fb0;
  uVar2 = uStack_bc0;
  local_bb8._0_2_ = auVar101._0_2_;
  local_bb8._2_2_ = auVar101._2_2_;
  local_bb8._4_2_ = auVar101._4_2_;
  local_bb8._6_2_ = auVar101._6_2_;
  uStack_bb0._0_2_ = auVar101._8_2_;
  uStack_bb0._2_2_ = auVar101._10_2_;
  uStack_bb0._4_2_ = auVar101._12_2_;
  uStack_bb0._6_2_ = auVar101._14_2_;
  local_bc8._0_2_ = (short)local_fb8;
  local_bc8._2_2_ = (short)((ulong)local_fb8 >> 0x10);
  local_bc8._4_2_ = (short)((ulong)local_fb8 >> 0x20);
  local_bc8._6_2_ = (short)((ulong)local_fb8 >> 0x30);
  uStack_bc0._0_2_ = (short)uStack_fb0;
  uStack_bc0._2_2_ = (short)((ulong)uStack_fb0 >> 0x10);
  uStack_bc0._4_2_ = (short)((ulong)uStack_fb0 >> 0x20);
  uStack_bc0._6_2_ = (short)((ulong)uStack_fb0 >> 0x30);
  local_1018._0_4_ =
       CONCAT22(-(ushort)(local_bb8._2_2_ == local_bc8._2_2_),
                -(ushort)((short)local_bb8 == (short)local_bc8));
  local_1018._0_6_ = CONCAT24(-(ushort)(local_bb8._4_2_ == local_bc8._4_2_),(undefined4)local_1018);
  local_1018 = CONCAT26(-(ushort)(local_bb8._6_2_ == local_bc8._6_2_),(undefined6)local_1018);
  uStack_1010._0_2_ = -(ushort)((short)uStack_bb0 == (short)uStack_bc0);
  uStack_1010._2_2_ = -(ushort)(uStack_bb0._2_2_ == uStack_bc0._2_2_);
  uStack_1010._4_2_ = -(ushort)(uStack_bb0._4_2_ == uStack_bc0._4_2_);
  uStack_1010._6_2_ = -(ushort)(uStack_bb0._6_2_ == uStack_bc0._6_2_);
  local_c08 = local_1018;
  uStack_c00 = uStack_1010;
  local_c18 = local_ff8;
  uStack_c10 = uStack_ff0;
  uStack_bd0 = local_1018 & local_ff8;
  local_be8 = local_fb8;
  uStack_be0 = uStack_fb0;
  local_bd8._0_2_ = (short)uStack_bd0;
  local_bd8._2_2_ = (short)(uStack_bd0 >> 0x10);
  local_bd8._4_2_ = (short)(uStack_bd0 >> 0x20);
  local_bd8._6_2_ = (short)(uStack_bd0 >> 0x30);
  local_bf8 = -(ushort)((short)local_bd8 == (short)local_bc8);
  sStack_bf6 = -(ushort)(local_bd8._2_2_ == local_bc8._2_2_);
  sStack_bf4 = -(ushort)(local_bd8._4_2_ == local_bc8._4_2_);
  sStack_bf2 = -(ushort)(local_bd8._6_2_ == local_bc8._6_2_);
  sStack_bf0 = -(ushort)((short)local_bd8 == (short)uStack_bc0);
  sStack_bee = -(ushort)(local_bd8._2_2_ == uStack_bc0._2_2_);
  sStack_bec = -(ushort)(local_bd8._4_2_ == uStack_bc0._4_2_);
  uStack_bea = -(ushort)(local_bd8._6_2_ == uStack_bc0._6_2_);
  auVar101._2_2_ = sStack_bf6;
  auVar101._0_2_ = local_bf8;
  auVar101._4_2_ = sStack_bf4;
  auVar101._6_2_ = sStack_bf2;
  auVar101._8_2_ = sStack_bf0;
  auVar101._10_2_ = sStack_bee;
  auVar101._12_2_ = sStack_bec;
  auVar101._14_2_ = uStack_bea;
  local_bd8 = uStack_bd0;
  local_bc8 = uVar1;
  uStack_bc0 = uVar2;
  local_bb8 = uVar3;
  uStack_bb0 = uVar4;
  local_4c8 = uVar5;
  uStack_4c0 = uVar6;
  local_4b8 = uVar97;
  uStack_4b0 = uVar108;
  local_4a8 = uVar113;
  uStack_4a0 = uVar114;
  local_1018 = uStack_bd0;
  uStack_1010 = uStack_bd0;
  if ((ushort)((ushort)(SUB161(auVar101 >> 7,0) & 1) | (ushort)(SUB161(auVar101 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar101 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar101 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar101 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar101 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar101 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar101 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar101 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar101 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar101 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar101 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar101 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar101 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uStack_bea >> 7) & 1) << 0xe | uStack_bea & 0x8000) != 0xffff) {
    local_8d8 = *local_f40;
    lStack_8d0 = local_f40[1];
    local_8c8._0_2_ = (short)local_8d8;
    local_8c8._2_2_ = (short)((ulong)local_8d8 >> 0x10);
    local_8c8._4_2_ = (short)((ulong)local_8d8 >> 0x20);
    local_8c8._6_2_ = (short)((ulong)local_8d8 >> 0x30);
    uStack_8c0._0_2_ = (short)lStack_8d0;
    uStack_8c0._2_2_ = (short)((ulong)lStack_8d0 >> 0x10);
    uStack_8c0._4_2_ = (short)((ulong)lStack_8d0 >> 0x20);
    uStack_8c0._6_2_ = (short)((ulong)lStack_8d0 >> 0x30);
    local_908 = (short)local_8c8 * 2;
    sStack_906 = local_8c8._2_2_ * 2;
    sStack_904 = local_8c8._4_2_ * 2;
    sStack_902 = local_8c8._6_2_ * 2;
    sStack_900 = (short)uStack_8c0 * 2;
    sStack_8fe = uStack_8c0._2_2_ * 2;
    sStack_8fc = uStack_8c0._4_2_ * 2;
    sStack_8fa = uStack_8c0._6_2_ * 2;
    uVar97 = *local_f50;
    uVar108 = local_f50[1];
    lVar25 = (*local_f60)[0];
    lVar26 = (*local_f60)[1];
    local_8e8._0_2_ = (short)uVar97;
    local_8e8._2_2_ = (short)(uVar97 >> 0x10);
    local_8e8._4_2_ = (short)(uVar97 >> 0x20);
    local_8e8._6_2_ = (short)(uVar97 >> 0x30);
    uStack_8e0._0_2_ = (short)uVar108;
    uStack_8e0._2_2_ = (short)(uVar108 >> 0x10);
    uStack_8e0._4_2_ = (short)(uVar108 >> 0x20);
    uStack_8e0._6_2_ = (short)(uVar108 >> 0x30);
    local_8f8._0_2_ = (short)lVar25;
    local_8f8._2_2_ = (short)((ulong)lVar25 >> 0x10);
    local_8f8._4_2_ = (short)((ulong)lVar25 >> 0x20);
    local_8f8._6_2_ = (short)((ulong)lVar25 >> 0x30);
    uStack_8f0._0_2_ = (short)lVar26;
    uStack_8f0._2_2_ = (short)((ulong)lVar26 >> 0x10);
    uStack_8f0._4_2_ = (short)((ulong)lVar26 >> 0x20);
    uStack_8f0._6_2_ = (short)((ulong)lVar26 >> 0x30);
    local_918 = (short)local_8e8 + (short)local_8f8;
    sStack_916 = local_8e8._2_2_ + local_8f8._2_2_;
    sStack_914 = local_8e8._4_2_ + local_8f8._4_2_;
    sStack_912 = local_8e8._6_2_ + local_8f8._6_2_;
    sStack_910 = (short)uStack_8e0 + (short)uStack_8f0;
    sStack_90e = uStack_8e0._2_2_ + uStack_8f0._2_2_;
    sStack_90c = uStack_8e0._4_2_ + uStack_8f0._4_2_;
    sStack_90a = uStack_8e0._6_2_ + uStack_8f0._6_2_;
    local_928 = CONCAT26(sStack_902 + sStack_912,
                         CONCAT24(sStack_904 + sStack_914,
                                  CONCAT22(sStack_906 + sStack_916,local_908 + local_918)));
    uStack_920 = CONCAT26(sStack_8fa + sStack_90a,
                          CONCAT24(sStack_8fc + sStack_90c,
                                   CONCAT22(sStack_8fe + sStack_90e,sStack_900 + sStack_910)));
    local_938 = local_10f8;
    uVar1 = local_938;
    uStack_930 = uStack_10f0;
    uVar2 = uStack_930;
    local_938._0_2_ = (short)local_10f8;
    local_938._2_2_ = (short)((ulong)local_10f8 >> 0x10);
    local_938._4_2_ = (short)((ulong)local_10f8 >> 0x20);
    local_938._6_2_ = (short)((ulong)local_10f8 >> 0x30);
    uStack_930._0_2_ = (short)uStack_10f0;
    uStack_930._2_2_ = (short)((ulong)uStack_10f0 >> 0x10);
    uStack_930._4_2_ = (short)((ulong)uStack_10f0 >> 0x20);
    uStack_930._6_2_ = (short)((ulong)uStack_10f0 >> 0x30);
    local_948 = local_908 + local_918 + (short)local_938;
    sStack_946 = sStack_906 + sStack_916 + local_938._2_2_;
    sStack_944 = sStack_904 + sStack_914 + local_938._4_2_;
    sStack_942 = sStack_902 + sStack_912 + local_938._6_2_;
    sStack_940 = sStack_900 + sStack_910 + (short)uStack_930;
    sStack_93e = sStack_8fe + sStack_90e + uStack_930._2_2_;
    sStack_93c = sStack_8fc + sStack_90c + uStack_930._4_2_;
    sStack_93a = sStack_8fa + sStack_90a + uStack_930._6_2_;
    lVar27 = (*local_f70)[0];
    lVar28 = (*local_f70)[1];
    local_958._0_2_ = (short)lVar27;
    local_958._2_2_ = (short)((ulong)lVar27 >> 0x10);
    local_958._4_2_ = (short)((ulong)lVar27 >> 0x20);
    local_958._6_2_ = (short)((ulong)lVar27 >> 0x30);
    uStack_950._0_2_ = (short)lVar28;
    uStack_950._2_2_ = (short)((ulong)lVar28 >> 0x10);
    uStack_950._4_2_ = (short)((ulong)lVar28 >> 0x20);
    uStack_950._6_2_ = (short)((ulong)lVar28 >> 0x30);
    local_958._0_2_ = local_948 + (short)local_958;
    local_958._2_2_ = sStack_946 + local_958._2_2_;
    local_958._4_2_ = sStack_944 + local_958._4_2_;
    local_958._6_2_ = sStack_942 + local_958._6_2_;
    uStack_950._0_2_ = sStack_940 + (short)uStack_950;
    uStack_950._2_2_ = sStack_93e + uStack_950._2_2_;
    uStack_950._4_2_ = sStack_93c + uStack_950._4_2_;
    uStack_950._6_2_ = sStack_93a + uStack_950._6_2_;
    lVar29 = (*local_f78)[0];
    lVar30 = (*local_f78)[1];
    uVar113 = *local_f50;
    uVar114 = local_f50[1];
    local_968._0_2_ = (short)lVar29;
    local_968._2_2_ = (short)((ulong)lVar29 >> 0x10);
    local_968._4_2_ = (short)((ulong)lVar29 >> 0x20);
    local_968._6_2_ = (short)((ulong)lVar29 >> 0x30);
    uStack_960._0_2_ = (short)lVar30;
    uStack_960._2_2_ = (short)((ulong)lVar30 >> 0x10);
    uStack_960._4_2_ = (short)((ulong)lVar30 >> 0x20);
    uStack_960._6_2_ = (short)((ulong)lVar30 >> 0x30);
    local_978._0_2_ = (short)uVar113;
    local_978._2_2_ = (short)(uVar113 >> 0x10);
    local_978._4_2_ = (short)(uVar113 >> 0x20);
    local_978._6_2_ = (short)(uVar113 >> 0x30);
    uStack_970._0_2_ = (short)uVar114;
    uStack_970._2_2_ = (short)(uVar114 >> 0x10);
    uStack_970._4_2_ = (short)(uVar114 >> 0x20);
    uStack_970._6_2_ = (short)(uVar114 >> 0x30);
    local_988 = (short)local_968 + (short)local_978;
    sStack_986 = local_968._2_2_ + local_978._2_2_;
    sStack_984 = local_968._4_2_ + local_978._4_2_;
    sStack_982 = local_968._6_2_ + local_978._6_2_;
    sStack_980 = (short)uStack_960 + (short)uStack_970;
    sStack_97e = uStack_960._2_2_ + uStack_970._2_2_;
    sStack_97c = uStack_960._4_2_ + uStack_970._4_2_;
    sStack_97a = uStack_960._6_2_ + uStack_970._6_2_;
    lVar31 = *local_f40;
    lVar32 = local_f40[1];
    local_998._0_2_ = (short)lVar31;
    local_998._2_2_ = (short)((ulong)lVar31 >> 0x10);
    local_998._4_2_ = (short)((ulong)lVar31 >> 0x20);
    local_998._6_2_ = (short)((ulong)lVar31 >> 0x30);
    uStack_990._0_2_ = (short)lVar32;
    uStack_990._2_2_ = (short)((ulong)lVar32 >> 0x10);
    uStack_990._4_2_ = (short)((ulong)lVar32 >> 0x20);
    uStack_990._6_2_ = (short)((ulong)lVar32 >> 0x30);
    local_9a8 = CONCAT26(local_958._6_2_,
                         CONCAT24(local_958._4_2_,CONCAT22(local_958._2_2_,(short)local_958)));
    uStack_9a0 = CONCAT26(uStack_950._6_2_,
                          CONCAT24(uStack_950._4_2_,CONCAT22(uStack_950._2_2_,(short)uStack_950)));
    local_9b8 = CONCAT26(sStack_982 + local_998._6_2_,
                         CONCAT24(sStack_984 + local_998._4_2_,
                                  CONCAT22(sStack_986 + local_998._2_2_,local_988 + (short)local_998
                                          )));
    uStack_9b0 = CONCAT26(sStack_97a + uStack_990._6_2_,
                          CONCAT24(sStack_97c + uStack_990._4_2_,
                                   CONCAT22(sStack_97e + uStack_990._2_2_,
                                            sStack_980 + (short)uStack_990)));
    local_1148 = (short)local_958 + local_988 + (short)local_998;
    uStack_1146 = local_958._2_2_ + sStack_986 + local_998._2_2_;
    uStack_1144 = local_958._4_2_ + sStack_984 + local_998._4_2_;
    uStack_1142 = local_958._6_2_ + sStack_982 + local_998._6_2_;
    sStack_1140 = (short)uStack_950 + sStack_980 + (short)uStack_990;
    sStack_113e = uStack_950._2_2_ + sStack_97e + uStack_990._2_2_;
    sStack_113c = uStack_950._4_2_ + sStack_97c + uStack_990._4_2_;
    sStack_113a = uStack_950._6_2_ + sStack_97a + uStack_990._6_2_;
    lVar33 = (*local_f78)[0];
    lVar34 = (*local_f78)[1];
    lVar35 = (*local_f68)[0];
    lVar36 = (*local_f68)[1];
    local_9c8._0_2_ = (short)lVar33;
    local_9c8._2_2_ = (short)((ulong)lVar33 >> 0x10);
    local_9c8._4_2_ = (short)((ulong)lVar33 >> 0x20);
    local_9c8._6_2_ = (short)((ulong)lVar33 >> 0x30);
    uStack_9c0._0_2_ = (short)lVar34;
    uStack_9c0._2_2_ = (short)((ulong)lVar34 >> 0x10);
    uStack_9c0._4_2_ = (short)((ulong)lVar34 >> 0x20);
    uStack_9c0._6_2_ = (short)((ulong)lVar34 >> 0x30);
    local_9d8._0_2_ = (short)lVar35;
    local_9d8._2_2_ = (short)((ulong)lVar35 >> 0x10);
    local_9d8._4_2_ = (short)((ulong)lVar35 >> 0x20);
    local_9d8._6_2_ = (short)((ulong)lVar35 >> 0x30);
    uStack_9d0._0_2_ = (short)lVar36;
    uStack_9d0._2_2_ = (short)((ulong)lVar36 >> 0x10);
    uStack_9d0._4_2_ = (short)((ulong)lVar36 >> 0x20);
    uStack_9d0._6_2_ = (short)((ulong)lVar36 >> 0x30);
    local_9e8 = (short)local_9c8 + (short)local_9d8;
    sStack_9e6 = local_9c8._2_2_ + local_9d8._2_2_;
    sStack_9e4 = local_9c8._4_2_ + local_9d8._4_2_;
    sStack_9e2 = local_9c8._6_2_ + local_9d8._6_2_;
    sStack_9e0 = (short)uStack_9c0 + (short)uStack_9d0;
    sStack_9de = uStack_9c0._2_2_ + uStack_9d0._2_2_;
    sStack_9dc = uStack_9c0._4_2_ + uStack_9d0._4_2_;
    sStack_9da = uStack_9c0._6_2_ + uStack_9d0._6_2_;
    lVar37 = (*local_f60)[0];
    lVar38 = (*local_f60)[1];
    local_9f8._0_2_ = (short)lVar37;
    local_9f8._2_2_ = (short)((ulong)lVar37 >> 0x10);
    local_9f8._4_2_ = (short)((ulong)lVar37 >> 0x20);
    local_9f8._6_2_ = (short)((ulong)lVar37 >> 0x30);
    uStack_9f0._0_2_ = (short)lVar38;
    uStack_9f0._2_2_ = (short)((ulong)lVar38 >> 0x10);
    uStack_9f0._4_2_ = (short)((ulong)lVar38 >> 0x20);
    uStack_9f0._6_2_ = (short)((ulong)lVar38 >> 0x30);
    local_9f8._0_2_ = local_9e8 + (short)local_9f8;
    local_9f8._2_2_ = sStack_9e6 + local_9f8._2_2_;
    local_9f8._4_2_ = sStack_9e4 + local_9f8._4_2_;
    local_9f8._6_2_ = sStack_9e2 + local_9f8._6_2_;
    uStack_9f0._0_2_ = sStack_9e0 + (short)uStack_9f0;
    uStack_9f0._2_2_ = sStack_9de + uStack_9f0._2_2_;
    uStack_9f0._4_2_ = sStack_9dc + uStack_9f0._4_2_;
    uStack_9f0._6_2_ = sStack_9da + uStack_9f0._6_2_;
    local_a08 = CONCAT26(local_958._6_2_,
                         CONCAT24(local_958._4_2_,CONCAT22(local_958._2_2_,(short)local_958)));
    uStack_a00 = CONCAT26(uStack_950._6_2_,
                          CONCAT24(uStack_950._4_2_,CONCAT22(uStack_950._2_2_,(short)uStack_950)));
    local_a18 = CONCAT26(local_9f8._6_2_,
                         CONCAT24(local_9f8._4_2_,CONCAT22(local_9f8._2_2_,(short)local_9f8)));
    uStack_a10 = CONCAT26(uStack_9f0._6_2_,
                          CONCAT24(uStack_9f0._4_2_,CONCAT22(uStack_9f0._2_2_,(short)uStack_9f0)));
    local_7c8 = CONCAT26(local_958._6_2_,
                         CONCAT24(local_958._4_2_,CONCAT22(local_958._2_2_,(short)local_958)));
    uStack_7c0 = CONCAT26(uStack_950._6_2_,
                          CONCAT24(uStack_950._4_2_,CONCAT22(uStack_950._2_2_,(short)uStack_950)));
    lVar39 = *local_f40;
    lVar40 = local_f40[1];
    local_7d8._0_2_ = (short)lVar39;
    local_7d8._2_2_ = (short)((ulong)lVar39 >> 0x10);
    local_7d8._4_2_ = (short)((ulong)lVar39 >> 0x20);
    local_7d8._6_2_ = (short)((ulong)lVar39 >> 0x30);
    uStack_7d0._0_2_ = (short)lVar40;
    uStack_7d0._2_2_ = (short)((ulong)lVar40 >> 0x10);
    uStack_7d0._4_2_ = (short)((ulong)lVar40 >> 0x20);
    uStack_7d0._6_2_ = (short)((ulong)lVar40 >> 0x30);
    local_a28 = (short)local_958 - (short)local_7d8;
    sStack_a26 = local_958._2_2_ - local_7d8._2_2_;
    sStack_a24 = local_958._4_2_ - local_7d8._4_2_;
    sStack_a22 = local_958._6_2_ - local_7d8._6_2_;
    sStack_a20 = (short)uStack_950 - (short)uStack_7d0;
    sStack_a1e = uStack_950._2_2_ - uStack_7d0._2_2_;
    sStack_a1c = uStack_950._4_2_ - uStack_7d0._4_2_;
    sStack_a1a = uStack_950._6_2_ - uStack_7d0._6_2_;
    lVar41 = (*local_f58)[0];
    lVar42 = (*local_f58)[1];
    local_a38._0_2_ = (short)lVar41;
    local_a38._2_2_ = (short)((ulong)lVar41 >> 0x10);
    local_a38._4_2_ = (short)((ulong)lVar41 >> 0x20);
    local_a38._6_2_ = (short)((ulong)lVar41 >> 0x30);
    uStack_a30._0_2_ = (short)lVar42;
    uStack_a30._2_2_ = (short)((ulong)lVar42 >> 0x10);
    uStack_a30._4_2_ = (short)((ulong)lVar42 >> 0x20);
    uStack_a30._6_2_ = (short)((ulong)lVar42 >> 0x30);
    local_a38._0_2_ = local_a28 + (short)local_a38;
    local_a38._2_2_ = sStack_a26 + local_a38._2_2_;
    local_a38._4_2_ = sStack_a24 + local_a38._4_2_;
    local_a38._6_2_ = sStack_a22 + local_a38._6_2_;
    uStack_a30._0_2_ = sStack_a20 + (short)uStack_a30;
    uStack_a30._2_2_ = sStack_a1e + uStack_a30._2_2_;
    uStack_a30._4_2_ = sStack_a1c + uStack_a30._4_2_;
    uStack_a30._6_2_ = sStack_a1a + uStack_a30._6_2_;
    local_7e8 = CONCAT26(local_9f8._6_2_,
                         CONCAT24(local_9f8._4_2_,CONCAT22(local_9f8._2_2_,(short)local_9f8)));
    uStack_7e0 = CONCAT26(uStack_9f0._6_2_,
                          CONCAT24(uStack_9f0._4_2_,CONCAT22(uStack_9f0._2_2_,(short)uStack_9f0)));
    lVar43 = (*local_f60)[0];
    lVar44 = (*local_f60)[1];
    local_7f8._0_2_ = (short)lVar43;
    local_7f8._2_2_ = (short)((ulong)lVar43 >> 0x10);
    local_7f8._4_2_ = (short)((ulong)lVar43 >> 0x20);
    local_7f8._6_2_ = (short)((ulong)lVar43 >> 0x30);
    uStack_7f0._0_2_ = (short)lVar44;
    uStack_7f0._2_2_ = (short)((ulong)lVar44 >> 0x10);
    uStack_7f0._4_2_ = (short)((ulong)lVar44 >> 0x20);
    uStack_7f0._6_2_ = (short)((ulong)lVar44 >> 0x30);
    local_a48 = (short)local_9f8 - (short)local_7f8;
    sStack_a46 = local_9f8._2_2_ - local_7f8._2_2_;
    sStack_a44 = local_9f8._4_2_ - local_7f8._4_2_;
    sStack_a42 = local_9f8._6_2_ - local_7f8._6_2_;
    sStack_a40 = (short)uStack_9f0 - (short)uStack_7f0;
    sStack_a3e = uStack_9f0._2_2_ - uStack_7f0._2_2_;
    sStack_a3c = uStack_9f0._4_2_ - uStack_7f0._4_2_;
    sStack_a3a = uStack_9f0._6_2_ - uStack_7f0._6_2_;
    lVar45 = (*local_f70)[0];
    lVar46 = (*local_f70)[1];
    local_a58._0_2_ = (short)lVar45;
    local_a58._2_2_ = (short)((ulong)lVar45 >> 0x10);
    local_a58._4_2_ = (short)((ulong)lVar45 >> 0x20);
    local_a58._6_2_ = (short)((ulong)lVar45 >> 0x30);
    uStack_a50._0_2_ = (short)lVar46;
    uStack_a50._2_2_ = (short)((ulong)lVar46 >> 0x10);
    uStack_a50._4_2_ = (short)((ulong)lVar46 >> 0x20);
    uStack_a50._6_2_ = (short)((ulong)lVar46 >> 0x30);
    local_a58._0_2_ = local_a48 + (short)local_a58;
    local_a58._2_2_ = sStack_a46 + local_a58._2_2_;
    local_a58._4_2_ = sStack_a44 + local_a58._4_2_;
    local_a58._6_2_ = sStack_a42 + local_a58._6_2_;
    uStack_a50._0_2_ = sStack_a40 + (short)uStack_a50;
    uStack_a50._2_2_ = sStack_a3e + uStack_a50._2_2_;
    uStack_a50._4_2_ = sStack_a3c + uStack_a50._4_2_;
    uStack_a50._6_2_ = sStack_a3a + uStack_a50._6_2_;
    local_a68 = CONCAT26(local_a38._6_2_,
                         CONCAT24(local_a38._4_2_,CONCAT22(local_a38._2_2_,(short)local_a38)));
    uStack_a60 = CONCAT26(uStack_a30._6_2_,
                          CONCAT24(uStack_a30._4_2_,CONCAT22(uStack_a30._2_2_,(short)uStack_a30)));
    local_a78 = CONCAT26(local_a58._6_2_,
                         CONCAT24(local_a58._4_2_,CONCAT22(local_a58._2_2_,(short)local_a58)));
    uStack_a70 = CONCAT26(uStack_a50._6_2_,
                          CONCAT24(uStack_a50._4_2_,CONCAT22(uStack_a50._2_2_,(short)uStack_a50)));
    local_768 = CONCAT26(local_a38._6_2_ + local_a58._6_2_,
                         CONCAT24(local_a38._4_2_ + local_a58._4_2_,
                                  CONCAT22(local_a38._2_2_ + local_a58._2_2_,
                                           (short)local_a38 + (short)local_a58)));
    uStack_760 = CONCAT26(local_958._6_2_ + local_9f8._6_2_,
                          CONCAT24(local_958._4_2_ + local_9f8._4_2_,
                                   CONCAT22(local_958._2_2_ + local_9f8._2_2_,
                                            (short)local_958 + (short)local_9f8)));
    local_76c = 3;
    local_10c8 = (ushort)((short)local_a38 + (short)local_a58) >> 3;
    uStack_10c6 = (ushort)(local_a38._2_2_ + local_a58._2_2_) >> 3;
    uStack_10c4 = (ushort)(local_a38._4_2_ + local_a58._4_2_) >> 3;
    uStack_10c2 = (ushort)(local_a38._6_2_ + local_a58._6_2_) >> 3;
    uStack_10c0 = (ushort)((short)local_958 + (short)local_9f8) >> 3;
    uStack_10be = (ushort)(local_958._2_2_ + local_9f8._2_2_) >> 3;
    uStack_10bc = (ushort)(local_958._4_2_ + local_9f8._4_2_) >> 3;
    uStack_10ba = (ushort)(local_958._6_2_ + local_9f8._6_2_) >> 3;
    local_808 = CONCAT26(local_a38._6_2_,
                         CONCAT24(local_a38._4_2_,CONCAT22(local_a38._2_2_,(short)local_a38)));
    uStack_800 = CONCAT26(uStack_a30._6_2_,
                          CONCAT24(uStack_a30._4_2_,CONCAT22(uStack_a30._2_2_,(short)uStack_a30)));
    lVar47 = *local_f40;
    lVar48 = local_f40[1];
    local_818._0_2_ = (short)lVar47;
    local_818._2_2_ = (short)((ulong)lVar47 >> 0x10);
    local_818._4_2_ = (short)((ulong)lVar47 >> 0x20);
    local_818._6_2_ = (short)((ulong)lVar47 >> 0x30);
    uStack_810._0_2_ = (short)lVar48;
    uStack_810._2_2_ = (short)((ulong)lVar48 >> 0x10);
    uStack_810._4_2_ = (short)((ulong)lVar48 >> 0x20);
    uStack_810._6_2_ = (short)((ulong)lVar48 >> 0x30);
    local_a88 = (short)local_a38 - (short)local_818;
    sStack_a86 = local_a38._2_2_ - local_818._2_2_;
    sStack_a84 = local_a38._4_2_ - local_818._4_2_;
    sStack_a82 = local_a38._6_2_ - local_818._6_2_;
    sStack_a80 = (short)uStack_a30 - (short)uStack_810;
    sStack_a7e = uStack_a30._2_2_ - uStack_810._2_2_;
    sStack_a7c = uStack_a30._4_2_ - uStack_810._4_2_;
    sStack_a7a = uStack_a30._6_2_ - uStack_810._6_2_;
    lVar49 = (*local_f48)[0];
    lVar50 = (*local_f48)[1];
    local_a98._0_2_ = (short)lVar49;
    local_a98._2_2_ = (short)((ulong)lVar49 >> 0x10);
    local_a98._4_2_ = (short)((ulong)lVar49 >> 0x20);
    local_a98._6_2_ = (short)((ulong)lVar49 >> 0x30);
    uStack_a90._0_2_ = (short)lVar50;
    uStack_a90._2_2_ = (short)((ulong)lVar50 >> 0x10);
    uStack_a90._4_2_ = (short)((ulong)lVar50 >> 0x20);
    uStack_a90._6_2_ = (short)((ulong)lVar50 >> 0x30);
    local_a98._0_2_ = local_a88 + (short)local_a98;
    local_a98._2_2_ = sStack_a86 + local_a98._2_2_;
    local_a98._4_2_ = sStack_a84 + local_a98._4_2_;
    local_a98._6_2_ = sStack_a82 + local_a98._6_2_;
    uStack_a90._0_2_ = sStack_a80 + (short)uStack_a90;
    uStack_a90._2_2_ = sStack_a7e + uStack_a90._2_2_;
    uStack_a90._4_2_ = sStack_a7c + uStack_a90._4_2_;
    uStack_a90._6_2_ = sStack_a7a + uStack_a90._6_2_;
    local_828 = CONCAT26(local_a58._6_2_,
                         CONCAT24(local_a58._4_2_,CONCAT22(local_a58._2_2_,(short)local_a58)));
    uStack_820 = CONCAT26(uStack_a50._6_2_,
                          CONCAT24(uStack_a50._4_2_,CONCAT22(uStack_a50._2_2_,(short)uStack_a50)));
    lVar51 = (*local_f70)[0];
    lVar52 = (*local_f70)[1];
    local_838._0_2_ = (short)lVar51;
    local_838._2_2_ = (short)((ulong)lVar51 >> 0x10);
    local_838._4_2_ = (short)((ulong)lVar51 >> 0x20);
    local_838._6_2_ = (short)((ulong)lVar51 >> 0x30);
    uStack_830._0_2_ = (short)lVar52;
    uStack_830._2_2_ = (short)((ulong)lVar52 >> 0x10);
    uStack_830._4_2_ = (short)((ulong)lVar52 >> 0x20);
    uStack_830._6_2_ = (short)((ulong)lVar52 >> 0x30);
    local_aa8 = (short)local_a58 - (short)local_838;
    sStack_aa6 = local_a58._2_2_ - local_838._2_2_;
    sStack_aa4 = local_a58._4_2_ - local_838._4_2_;
    sStack_aa2 = local_a58._6_2_ - local_838._6_2_;
    sStack_aa0 = (short)uStack_a50 - (short)uStack_830;
    sStack_a9e = uStack_a50._2_2_ - uStack_830._2_2_;
    sStack_a9c = uStack_a50._4_2_ - uStack_830._4_2_;
    sStack_a9a = uStack_a50._6_2_ - uStack_830._6_2_;
    lVar53 = (*local_f78)[0];
    lVar54 = (*local_f78)[1];
    local_ab8._0_2_ = (short)lVar53;
    local_ab8._2_2_ = (short)((ulong)lVar53 >> 0x10);
    local_ab8._4_2_ = (short)((ulong)lVar53 >> 0x20);
    local_ab8._6_2_ = (short)((ulong)lVar53 >> 0x30);
    uStack_ab0._0_2_ = (short)lVar54;
    uStack_ab0._2_2_ = (short)((ulong)lVar54 >> 0x10);
    uStack_ab0._4_2_ = (short)((ulong)lVar54 >> 0x20);
    uStack_ab0._6_2_ = (short)((ulong)lVar54 >> 0x30);
    local_ab8._0_2_ = local_aa8 + (short)local_ab8;
    local_ab8._2_2_ = sStack_aa6 + local_ab8._2_2_;
    local_ab8._4_2_ = sStack_aa4 + local_ab8._4_2_;
    local_ab8._6_2_ = sStack_aa2 + local_ab8._6_2_;
    uStack_ab0._0_2_ = sStack_aa0 + (short)uStack_ab0;
    uStack_ab0._2_2_ = sStack_a9e + uStack_ab0._2_2_;
    uStack_ab0._4_2_ = sStack_a9c + uStack_ab0._4_2_;
    uStack_ab0._6_2_ = sStack_a9a + uStack_ab0._6_2_;
    local_ac8 = CONCAT26(local_a98._6_2_,
                         CONCAT24(local_a98._4_2_,CONCAT22(local_a98._2_2_,(short)local_a98)));
    uStack_ac0 = CONCAT26(uStack_a90._6_2_,
                          CONCAT24(uStack_a90._4_2_,CONCAT22(uStack_a90._2_2_,(short)uStack_a90)));
    local_ad8 = CONCAT26(local_ab8._6_2_,
                         CONCAT24(local_ab8._4_2_,CONCAT22(local_ab8._2_2_,(short)local_ab8)));
    uStack_ad0 = CONCAT26(uStack_ab0._6_2_,
                          CONCAT24(uStack_ab0._4_2_,CONCAT22(uStack_ab0._2_2_,(short)uStack_ab0)));
    local_1158 = (short)local_a98 + (short)local_ab8;
    uStack_1156 = local_a98._2_2_ + local_ab8._2_2_;
    uStack_1154 = local_a98._4_2_ + local_ab8._4_2_;
    uStack_1152 = local_a98._6_2_ + local_ab8._6_2_;
    sStack_1150 = (short)uStack_a90 + (short)uStack_ab0;
    sStack_114e = uStack_a90._2_2_ + uStack_ab0._2_2_;
    sStack_114c = uStack_a90._4_2_ + uStack_ab0._4_2_;
    sStack_114a = uStack_a90._6_2_ + uStack_ab0._6_2_;
    local_848 = CONCAT26(local_a98._6_2_,
                         CONCAT24(local_a98._4_2_,CONCAT22(local_a98._2_2_,(short)local_a98)));
    uStack_840 = CONCAT26(uStack_a90._6_2_,
                          CONCAT24(uStack_a90._4_2_,CONCAT22(uStack_a90._2_2_,(short)uStack_a90)));
    uVar55 = *local_f50;
    uVar56 = local_f50[1];
    local_858._0_2_ = (short)uVar55;
    local_858._2_2_ = (short)(uVar55 >> 0x10);
    local_858._4_2_ = (short)(uVar55 >> 0x20);
    local_858._6_2_ = (short)(uVar55 >> 0x30);
    uStack_850._0_2_ = (short)uVar56;
    uStack_850._2_2_ = (short)(uVar56 >> 0x10);
    uStack_850._4_2_ = (short)(uVar56 >> 0x20);
    uStack_850._6_2_ = (short)(uVar56 >> 0x30);
    local_ae8 = (short)local_a98 - (short)local_858;
    sStack_ae6 = local_a98._2_2_ - local_858._2_2_;
    sStack_ae4 = local_a98._4_2_ - local_858._4_2_;
    sStack_ae2 = local_a98._6_2_ - local_858._6_2_;
    sStack_ae0 = (short)uStack_a90 - (short)uStack_850;
    sStack_ade = uStack_a90._2_2_ - uStack_850._2_2_;
    sStack_adc = uStack_a90._4_2_ - uStack_850._4_2_;
    sStack_ada = uStack_a90._6_2_ - uStack_850._6_2_;
    lVar57 = (*local_f48)[0];
    lVar58 = (*local_f48)[1];
    local_af8._0_2_ = (short)lVar57;
    local_af8._2_2_ = (short)((ulong)lVar57 >> 0x10);
    local_af8._4_2_ = (short)((ulong)lVar57 >> 0x20);
    local_af8._6_2_ = (short)((ulong)lVar57 >> 0x30);
    uStack_af0._0_2_ = (short)lVar58;
    uStack_af0._2_2_ = (short)((ulong)lVar58 >> 0x10);
    uStack_af0._4_2_ = (short)((ulong)lVar58 >> 0x20);
    uStack_af0._6_2_ = (short)((ulong)lVar58 >> 0x30);
    local_af8._0_2_ = local_ae8 + (short)local_af8;
    local_af8._2_2_ = sStack_ae6 + local_af8._2_2_;
    local_af8._4_2_ = sStack_ae4 + local_af8._4_2_;
    local_af8._6_2_ = sStack_ae2 + local_af8._6_2_;
    uStack_af0._0_2_ = sStack_ae0 + (short)uStack_af0;
    uStack_af0._2_2_ = sStack_ade + uStack_af0._2_2_;
    uStack_af0._4_2_ = sStack_adc + uStack_af0._4_2_;
    uStack_af0._6_2_ = sStack_ada + uStack_af0._6_2_;
    local_868 = CONCAT26(local_ab8._6_2_,
                         CONCAT24(local_ab8._4_2_,CONCAT22(local_ab8._2_2_,(short)local_ab8)));
    uStack_860 = CONCAT26(uStack_ab0._6_2_,
                          CONCAT24(uStack_ab0._4_2_,CONCAT22(uStack_ab0._2_2_,(short)uStack_ab0)));
    lVar59 = (*local_f78)[0];
    lVar60 = (*local_f78)[1];
    local_878._0_2_ = (short)lVar59;
    local_878._2_2_ = (short)((ulong)lVar59 >> 0x10);
    local_878._4_2_ = (short)((ulong)lVar59 >> 0x20);
    local_878._6_2_ = (short)((ulong)lVar59 >> 0x30);
    uStack_870._0_2_ = (short)lVar60;
    uStack_870._2_2_ = (short)((ulong)lVar60 >> 0x10);
    uStack_870._4_2_ = (short)((ulong)lVar60 >> 0x20);
    uStack_870._6_2_ = (short)((ulong)lVar60 >> 0x30);
    local_b08 = (short)local_ab8 - (short)local_878;
    sStack_b06 = local_ab8._2_2_ - local_878._2_2_;
    sStack_b04 = local_ab8._4_2_ - local_878._4_2_;
    sStack_b02 = local_ab8._6_2_ - local_878._6_2_;
    sStack_b00 = (short)uStack_ab0 - (short)uStack_870;
    sStack_afe = uStack_ab0._2_2_ - uStack_870._2_2_;
    sStack_afc = uStack_ab0._4_2_ - uStack_870._4_2_;
    sStack_afa = uStack_ab0._6_2_ - uStack_870._6_2_;
    lVar61 = (*local_f68)[0];
    lVar62 = (*local_f68)[1];
    local_b18._0_2_ = (short)lVar61;
    local_b18._2_2_ = (short)((ulong)lVar61 >> 0x10);
    local_b18._4_2_ = (short)((ulong)lVar61 >> 0x20);
    local_b18._6_2_ = (short)((ulong)lVar61 >> 0x30);
    uStack_b10._0_2_ = (short)lVar62;
    uStack_b10._2_2_ = (short)((ulong)lVar62 >> 0x10);
    uStack_b10._4_2_ = (short)((ulong)lVar62 >> 0x20);
    uStack_b10._6_2_ = (short)((ulong)lVar62 >> 0x30);
    local_b18._0_2_ = local_b08 + (short)local_b18;
    local_b18._2_2_ = sStack_b06 + local_b18._2_2_;
    local_b18._4_2_ = sStack_b04 + local_b18._4_2_;
    local_b18._6_2_ = sStack_b02 + local_b18._6_2_;
    uStack_b10._0_2_ = sStack_b00 + (short)uStack_b10;
    uStack_b10._2_2_ = sStack_afe + uStack_b10._2_2_;
    uStack_b10._4_2_ = sStack_afc + uStack_b10._4_2_;
    uStack_b10._6_2_ = sStack_afa + uStack_b10._6_2_;
    local_b28 = CONCAT26(local_af8._6_2_,
                         CONCAT24(local_af8._4_2_,CONCAT22(local_af8._2_2_,(short)local_af8)));
    uStack_b20 = CONCAT26(uStack_af0._6_2_,
                          CONCAT24(uStack_af0._4_2_,CONCAT22(uStack_af0._2_2_,(short)uStack_af0)));
    local_b38 = CONCAT26(local_b18._6_2_,
                         CONCAT24(local_b18._4_2_,CONCAT22(local_b18._2_2_,(short)local_b18)));
    uStack_b30 = CONCAT26(uStack_b10._6_2_,
                          CONCAT24(uStack_b10._4_2_,CONCAT22(uStack_b10._2_2_,(short)uStack_b10)));
    local_1168 = (short)local_af8 + (short)local_b18;
    uStack_1166 = local_af8._2_2_ + local_b18._2_2_;
    uStack_1164 = local_af8._4_2_ + local_b18._4_2_;
    uStack_1162 = local_af8._6_2_ + local_b18._6_2_;
    sStack_1160 = (short)uStack_af0 + (short)uStack_b10;
    sStack_115e = uStack_af0._2_2_ + uStack_b10._2_2_;
    sStack_115c = uStack_af0._4_2_ + uStack_b10._4_2_;
    sStack_115a = uStack_af0._6_2_ + uStack_b10._6_2_;
    local_788 = CONCAT26(uStack_1152,CONCAT24(uStack_1154,CONCAT22(uStack_1156,local_1158)));
    uStack_780 = CONCAT26(uStack_1162,CONCAT24(uStack_1164,CONCAT22(uStack_1166,local_1168)));
    local_78c = 3;
    local_10d8 = local_1158 >> 3;
    uStack_10d6 = uStack_1156 >> 3;
    uStack_10d4 = uStack_1154 >> 3;
    uStack_10d2 = uStack_1152 >> 3;
    uStack_10d0 = local_1168 >> 3;
    uStack_10ce = uStack_1166 >> 3;
    uStack_10cc = uStack_1164 >> 3;
    uStack_10ca = uStack_1162 >> 3;
    local_888 = CONCAT26(local_af8._6_2_,
                         CONCAT24(local_af8._4_2_,CONCAT22(local_af8._2_2_,(short)local_af8)));
    uStack_880 = CONCAT26(uStack_af0._6_2_,
                          CONCAT24(uStack_af0._4_2_,CONCAT22(uStack_af0._2_2_,(short)uStack_af0)));
    lVar63 = (*local_f60)[0];
    lVar64 = (*local_f60)[1];
    local_898._0_2_ = (short)lVar63;
    local_898._2_2_ = (short)((ulong)lVar63 >> 0x10);
    local_898._4_2_ = (short)((ulong)lVar63 >> 0x20);
    local_898._6_2_ = (short)((ulong)lVar63 >> 0x30);
    uStack_890._0_2_ = (short)lVar64;
    uStack_890._2_2_ = (short)((ulong)lVar64 >> 0x10);
    uStack_890._4_2_ = (short)((ulong)lVar64 >> 0x20);
    uStack_890._6_2_ = (short)((ulong)lVar64 >> 0x30);
    local_b48 = (short)local_af8 - (short)local_898;
    sStack_b46 = local_af8._2_2_ - local_898._2_2_;
    sStack_b44 = local_af8._4_2_ - local_898._4_2_;
    sStack_b42 = local_af8._6_2_ - local_898._6_2_;
    sStack_b40 = (short)uStack_af0 - (short)uStack_890;
    sStack_b3e = uStack_af0._2_2_ - uStack_890._2_2_;
    sStack_b3c = uStack_af0._4_2_ - uStack_890._4_2_;
    sStack_b3a = uStack_af0._6_2_ - uStack_890._6_2_;
    lVar65 = (*local_f48)[0];
    lVar66 = (*local_f48)[1];
    local_b58._0_2_ = (short)lVar65;
    local_b58._2_2_ = (short)((ulong)lVar65 >> 0x10);
    local_b58._4_2_ = (short)((ulong)lVar65 >> 0x20);
    local_b58._6_2_ = (short)((ulong)lVar65 >> 0x30);
    uStack_b50._0_2_ = (short)lVar66;
    uStack_b50._2_2_ = (short)((ulong)lVar66 >> 0x10);
    uStack_b50._4_2_ = (short)((ulong)lVar66 >> 0x20);
    uStack_b50._6_2_ = (short)((ulong)lVar66 >> 0x30);
    local_8a8 = CONCAT26(local_b18._6_2_,
                         CONCAT24(local_b18._4_2_,CONCAT22(local_b18._2_2_,(short)local_b18)));
    uStack_8a0 = CONCAT26(uStack_b10._6_2_,
                          CONCAT24(uStack_b10._4_2_,CONCAT22(uStack_b10._2_2_,(short)uStack_b10)));
    lVar67 = (*local_f68)[0];
    lVar68 = (*local_f68)[1];
    local_8b8._0_2_ = (short)lVar67;
    local_8b8._2_2_ = (short)((ulong)lVar67 >> 0x10);
    local_8b8._4_2_ = (short)((ulong)lVar67 >> 0x20);
    local_8b8._6_2_ = (short)((ulong)lVar67 >> 0x30);
    uStack_8b0._0_2_ = (short)lVar68;
    uStack_8b0._2_2_ = (short)((ulong)lVar68 >> 0x10);
    uStack_8b0._4_2_ = (short)((ulong)lVar68 >> 0x20);
    uStack_8b0._6_2_ = (short)((ulong)lVar68 >> 0x30);
    local_b68 = (short)local_b18 - (short)local_8b8;
    sStack_b66 = local_b18._2_2_ - local_8b8._2_2_;
    sStack_b64 = local_b18._4_2_ - local_8b8._4_2_;
    sStack_b62 = local_b18._6_2_ - local_8b8._6_2_;
    sStack_b60 = (short)uStack_b10 - (short)uStack_8b0;
    sStack_b5e = uStack_b10._2_2_ - uStack_8b0._2_2_;
    sStack_b5c = uStack_b10._4_2_ - uStack_8b0._4_2_;
    sStack_b5a = uStack_b10._6_2_ - uStack_8b0._6_2_;
    lVar69 = (*local_f58)[0];
    lVar70 = (*local_f58)[1];
    local_b78._0_2_ = (short)lVar69;
    local_b78._2_2_ = (short)((ulong)lVar69 >> 0x10);
    local_b78._4_2_ = (short)((ulong)lVar69 >> 0x20);
    local_b78._6_2_ = (short)((ulong)lVar69 >> 0x30);
    uStack_b70._0_2_ = (short)lVar70;
    uStack_b70._2_2_ = (short)((ulong)lVar70 >> 0x10);
    uStack_b70._4_2_ = (short)((ulong)lVar70 >> 0x20);
    uStack_b70._6_2_ = (short)((ulong)lVar70 >> 0x30);
    local_1138 = local_b68 + (short)local_b78;
    sStack_1136 = sStack_b66 + local_b78._2_2_;
    sStack_1134 = sStack_b64 + local_b78._4_2_;
    sStack_1132 = sStack_b62 + local_b78._6_2_;
    sStack_1130 = sStack_b60 + (short)uStack_b70;
    sStack_112e = sStack_b5e + uStack_b70._2_2_;
    sStack_112c = sStack_b5c + uStack_b70._4_2_;
    sStack_112a = sStack_b5a + uStack_b70._6_2_;
    local_b88 = CONCAT26(sStack_b42 + local_b58._6_2_,
                         CONCAT24(sStack_b44 + local_b58._4_2_,
                                  CONCAT22(sStack_b46 + local_b58._2_2_,local_b48 + (short)local_b58
                                          )));
    uStack_b80 = CONCAT26(sStack_b3a + uStack_b50._6_2_,
                          CONCAT24(sStack_b3c + uStack_b50._4_2_,
                                   CONCAT22(sStack_b3e + uStack_b50._2_2_,
                                            sStack_b40 + (short)uStack_b50)));
    local_b98 = CONCAT26(sStack_1132,CONCAT24(sStack_1134,CONCAT22(sStack_1136,local_1138)));
    uStack_b90 = CONCAT26(sStack_112a,CONCAT24(sStack_112c,CONCAT22(sStack_112e,sStack_1130)));
    local_1128 = local_b48 + (short)local_b58 + local_1138;
    uStack_1126 = sStack_b46 + local_b58._2_2_ + sStack_1136;
    uStack_1124 = sStack_b44 + local_b58._4_2_ + sStack_1134;
    uStack_1122 = sStack_b42 + local_b58._6_2_ + sStack_1132;
    sStack_1120 = sStack_b40 + (short)uStack_b50 + sStack_1130;
    sStack_111e = sStack_b3e + uStack_b50._2_2_ + sStack_112e;
    sStack_111c = sStack_b3c + uStack_b50._4_2_ + sStack_112c;
    sStack_111a = sStack_b3a + uStack_b50._6_2_ + sStack_112a;
    local_f18 = CONCAT26(uStack_1142,CONCAT24(uStack_1144,CONCAT22(uStack_1146,local_1148)));
    local_f28 = CONCAT26(uStack_1122,CONCAT24(uStack_1124,CONCAT22(uStack_1126,local_1128)));
    uStack_f20 = CONCAT26(sStack_111a,CONCAT24(sStack_111c,CONCAT22(sStack_111e,sStack_1120)));
    local_7ac = 3;
    local_10b8 = local_1148 >> 3;
    uStack_10b6 = uStack_1146 >> 3;
    uStack_10b4 = uStack_1144 >> 3;
    uStack_10b2 = uStack_1142 >> 3;
    uStack_10b0 = local_1128 >> 3;
    uStack_10ae = uStack_1126 >> 3;
    uStack_10ac = uStack_1124 >> 3;
    uStack_10aa = uStack_1122 >> 3;
    local_6d8 = *(ulong *)*local_f80;
    uStack_6d0 = *(ulong *)((long)*local_f80 + 8);
    local_1098 = ~uStack_bd0 & local_6d8;
    uStack_1090 = ~uStack_bd0 & uStack_6d0;
    local_c38 = CONCAT26(uStack_10d2,CONCAT24(uStack_10d4,CONCAT22(uStack_10d6,local_10d8)));
    uStack_c30 = CONCAT26(uStack_10ca,CONCAT24(uStack_10cc,CONCAT22(uStack_10ce,uStack_10d0)));
    local_1078 = uStack_bd0 & local_c38;
    uStack_1070 = uStack_bd0 & uStack_c30;
    uVar109 = uStack_1090 | uStack_1070;
    local_c28 = uStack_bd0;
    uStack_c20 = uStack_bd0;
    local_b78 = lVar69;
    uStack_b70 = lVar70;
    local_b58 = lVar65;
    uStack_b50 = lVar66;
    local_b18 = lVar61;
    uStack_b10 = lVar62;
    local_af8 = lVar57;
    uStack_af0 = lVar58;
    local_ab8 = lVar53;
    uStack_ab0 = lVar54;
    local_a98 = lVar49;
    uStack_a90 = lVar50;
    local_a58 = lVar45;
    uStack_a50 = lVar46;
    local_a38 = lVar41;
    uStack_a30 = lVar42;
    local_9f8 = lVar37;
    uStack_9f0 = lVar38;
    local_9d8 = lVar35;
    uStack_9d0 = lVar36;
    local_9c8 = lVar33;
    uStack_9c0 = lVar34;
    local_998 = lVar31;
    uStack_990 = lVar32;
    local_978 = uVar113;
    uStack_970 = uVar114;
    local_968 = lVar29;
    uStack_960 = lVar30;
    local_958 = lVar27;
    uStack_950 = lVar28;
    local_938 = uVar1;
    uStack_930 = uVar2;
    local_8f8 = lVar25;
    uStack_8f0 = lVar26;
    local_8e8 = uVar97;
    uStack_8e0 = uVar108;
    local_8c8 = local_8d8;
    uStack_8c0 = lStack_8d0;
    local_8b8 = lVar67;
    uStack_8b0 = lVar68;
    local_898 = lVar63;
    uStack_890 = lVar64;
    local_878 = lVar59;
    uStack_870 = lVar60;
    local_858 = uVar55;
    uStack_850 = uVar56;
    local_838 = lVar51;
    uStack_830 = lVar52;
    local_818 = lVar47;
    uStack_810 = lVar48;
    local_7f8 = lVar43;
    uStack_7f0 = lVar44;
    local_7d8 = lVar39;
    uStack_7d0 = lVar40;
    local_7a8 = local_f18;
    uStack_7a0 = local_f28;
    local_6c8 = uStack_bd0;
    uStack_6c0 = uStack_bd0;
    local_678 = local_1078;
    uStack_670 = uStack_1070;
    local_668 = local_1098;
    uStack_660 = uStack_1090;
    *(ulong *)*local_f80 = local_1098 | local_1078;
    *(ulong *)((long)*pauVar92 + 8) = uVar109;
    pauVar92 = local_f88;
    local_6f8 = *(ulong *)*local_f88;
    uStack_6f0 = *(ulong *)((long)*local_f88 + 8);
    local_6e8 = local_1018;
    uStack_6e0 = uStack_1010;
    local_1088 = ~local_1018 & local_6f8;
    uStack_1080 = ~uStack_1010 & uStack_6f0;
    local_c58 = CONCAT26(uStack_10c2,CONCAT24(uStack_10c4,CONCAT22(uStack_10c6,local_10c8)));
    uStack_c50 = CONCAT26(uStack_10ba,CONCAT24(uStack_10bc,CONCAT22(uStack_10be,uStack_10c0)));
    local_c48 = local_1018;
    uStack_c40 = uStack_1010;
    local_1068 = local_1018 & local_c58;
    uStack_1060 = uStack_1010 & uStack_c50;
    uVar97 = uStack_1080 | uStack_1060;
    local_698 = local_1068;
    uStack_690 = uStack_1060;
    local_688 = local_1088;
    uStack_680 = uStack_1080;
    *(ulong *)*local_f88 = local_1088 | local_1068;
    *(ulong *)((long)*pauVar92 + 8) = uVar97;
    puVar94 = local_f50;
    local_708 = local_1018;
    uStack_700 = uStack_1010;
    local_718 = local_1038;
    uStack_710 = uStack_1030;
    local_10a8 = ~local_1018 & local_1038;
    uStack_10a0 = ~uStack_1010 & uStack_1030;
    local_c78 = CONCAT26(uStack_10b2,CONCAT24(uStack_10b4,CONCAT22(uStack_10b6,local_10b8)));
    uStack_c70 = CONCAT26(uStack_10aa,CONCAT24(uStack_10ac,CONCAT22(uStack_10ae,uStack_10b0)));
    local_c68 = local_1018;
    uStack_c60 = uStack_1010;
    uVar97 = uStack_1010 & uStack_c70;
    *local_f50 = local_1018 & local_c78;
    puVar94[1] = uVar97;
    puVar94 = local_f50;
    local_6b8 = *local_f50;
    uStack_6b0 = local_f50[1];
    local_6a8 = local_10a8;
    uStack_6a0 = uStack_10a0;
    uVar97 = uStack_10a0 | uStack_6b0;
    *local_f50 = local_10a8 | local_6b8;
    puVar94[1] = uVar97;
    palVar115 = local_f58;
    (*local_f58)[0] = local_f50[1];
    (*palVar115)[1] = 0;
  }
  local_12e8 = lStack_1320;
  lStack_12e0 = 0;
  local_1308[0] = lStack_1310;
  local_1308[1] = 0;
  highbd_transpose8x8_low_sse2
            ((__m128i *)&local_1248,(__m128i *)&local_1258,(__m128i *)&local_12e8,
             (__m128i *)&local_1328,(__m128i *)&local_1318,(__m128i *)local_1308,&local_12a8,
             &local_12b8,(__m128i *)&local_1248,(__m128i *)&local_1258,(__m128i *)&local_1268,
             (__m128i *)&local_1278);
  local_1210[-1] = local_1248;
  *local_1210 = lStack_1240;
  puVar94 = (ulong *)((long)local_1210 + (long)local_1214 * 2 + -8);
  *puVar94 = local_1258;
  puVar94[1] = uStack_1250;
  plVar95 = (longlong *)((long)local_1210 + (long)(local_1214 << 1) * 2 + -8);
  *plVar95 = local_1268;
  plVar95[1] = lStack_1260;
  local_1210 = (longlong *)((long)local_1210 + (long)(local_1214 * 3) * 2 + -8);
  *local_1210 = local_1278;
  local_1210[1] = lStack_1270;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_8_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i p2, p1, p0, p3, q0;
  __m128i q1q0, p1p0;

  p3 = _mm_loadu_si128((__m128i *)((s - 4) + 0 * p));
  p2 = _mm_loadu_si128((__m128i *)((s - 4) + 1 * p));
  p1 = _mm_loadu_si128((__m128i *)((s - 4) + 2 * p));
  p0 = _mm_loadu_si128((__m128i *)((s - 4) + 3 * p));

  highbd_transpose4x8_8x4_sse2(&p3, &p2, &p1, &p0, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  // Loop filtering
  highbd_lpf_internal_8_sse2(&d0, &d7, &d1, &d6, &d2, &d5, &d3, &d4, &q1q0,
                             &p1p0, blimit, limit, thresh, bd);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  highbd_transpose8x8_low_sse2(&d0, &d1, &p0, &p1p0, &q1q0, &q0, &d6, &d7, &d0,
                               &d1, &d2, &d3);

  _mm_storeu_si128((__m128i *)(s - 4 + 0 * p), d0);
  _mm_storeu_si128((__m128i *)(s - 4 + 1 * p), d1);
  _mm_storeu_si128((__m128i *)(s - 4 + 2 * p), d2);
  _mm_storeu_si128((__m128i *)(s - 4 + 3 * p), d3);
}